

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

void embree::avx2::CurveNiIntersectorK<4,4>::
     intersect_n<embree::avx2::OrientedCurve1IntersectorK<embree::BezierCurveT,4>,embree::avx2::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  BBox1f BVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  Primitive PVar3;
  uint uVar4;
  Geometry *pGVar5;
  RTCFilterFunctionN p_Var6;
  void *pvVar7;
  __int_type_conflict _Var8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [32];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  int iVar22;
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  uint uVar47;
  uint uVar48;
  long lVar49;
  byte bVar50;
  uint uVar51;
  undefined4 uVar52;
  undefined8 unaff_RBP;
  ulong uVar53;
  ulong uVar54;
  ulong uVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar83;
  float fVar85;
  vint4 bi_2;
  undefined1 auVar60 [16];
  float fVar86;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  float fVar84;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  float fVar87;
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined8 uVar88;
  vint4 bi_1;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined8 extraout_XMM1_Qa;
  undefined1 auVar105 [16];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 extraout_var [56];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  float fVar119;
  vint4 ai_2;
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  float fVar131;
  float fVar142;
  vint4 ai;
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [32];
  vint4 bi;
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [32];
  float fVar157;
  float fVar175;
  float fVar176;
  vint4 ai_1;
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  float fVar177;
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [32];
  float fVar190;
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar182 [16];
  float fVar192;
  float fVar193;
  float fVar194;
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  float fVar191;
  undefined1 auVar189 [32];
  float fVar195;
  float fVar204;
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  float fVar205;
  float fVar220;
  vfloat4 a0_2;
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  float fVar221;
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [32];
  undefined1 auVar219 [64];
  vfloat4 a0_3;
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  vfloat4 a0_1;
  undefined1 auVar247 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar246 [16];
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  undefined1 auVar254 [32];
  float fVar255;
  float fVar267;
  float fVar268;
  vfloat4 a0;
  undefined1 auVar256 [16];
  float fVar269;
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [32];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar272 [16];
  undefined1 auVar276 [32];
  undefined1 auVar277 [32];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar283 [32];
  undefined1 local_668 [8];
  undefined8 uStack_660;
  undefined8 uStack_658;
  undefined8 uStack_650;
  vfloat_impl<4> p00;
  undefined1 local_568 [32];
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  undefined1 local_528 [16];
  undefined1 (*local_510) [16];
  undefined1 local_508 [8];
  float fStack_500;
  float fStack_4fc;
  undefined1 auStack_4f8 [16];
  undefined1 local_4e8 [32];
  RTCFilterFunctionNArguments args;
  float local_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  undefined4 local_428;
  undefined4 local_418;
  undefined1 local_3e8 [8];
  float fStack_3e0;
  float fStack_3dc;
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  uint mask_stack [4];
  float local_368;
  float fStack_364;
  float fStack_360;
  float fStack_35c;
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  RTCHitN local_248 [16];
  undefined1 local_238 [16];
  undefined4 local_228;
  undefined4 uStack_224;
  undefined4 uStack_220;
  undefined4 uStack_21c;
  undefined1 local_218 [16];
  undefined1 local_208 [16];
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined1 local_1e8 [16];
  uint local_1d8;
  uint uStack_1d4;
  uint uStack_1d0;
  uint uStack_1cc;
  uint uStack_1c8;
  uint uStack_1c4;
  uint uStack_1c0;
  uint uStack_1bc;
  undefined1 local_1b8 [32];
  undefined1 local_198 [32];
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  float fStack_144;
  float fStack_140;
  undefined4 uStack_13c;
  undefined1 local_138 [32];
  undefined1 local_118 [32];
  undefined1 local_f8 [32];
  undefined1 local_d8 [32];
  undefined1 local_b8 [32];
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float fStack_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  BBox1f cv_stack [4];
  undefined1 auVar110 [64];
  undefined1 auVar282 [32];
  
  PVar3 = prim[1];
  uVar53 = (ulong)(byte)PVar3;
  auVar105 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x10);
  auVar105 = vinsertps_avx(auVar105,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar9 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                         ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar9 = vinsertps_avx(auVar9,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  fVar56 = *(float *)(prim + uVar53 * 0x19 + 0x12);
  auVar105 = vsubps_avx(auVar105,*(undefined1 (*) [16])(prim + uVar53 * 0x19 + 6));
  auVar60._0_4_ = fVar56 * auVar105._0_4_;
  auVar60._4_4_ = fVar56 * auVar105._4_4_;
  auVar60._8_4_ = fVar56 * auVar105._8_4_;
  auVar60._12_4_ = fVar56 * auVar105._12_4_;
  auVar143._0_4_ = fVar56 * auVar9._0_4_;
  auVar143._4_4_ = fVar56 * auVar9._4_4_;
  auVar143._8_4_ = fVar56 * auVar9._8_4_;
  auVar143._12_4_ = fVar56 * auVar9._12_4_;
  auVar105 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar53 * 4 + 6)));
  auVar105 = vcvtdq2ps_avx(auVar105);
  auVar9 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar53 * 5 + 6)));
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar11 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar53 * 6 + 6)));
  auVar11 = vcvtdq2ps_avx(auVar11);
  auVar12 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar53 * 0xb + 6)));
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar13 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar53 * 0xc + 6)));
  auVar13 = vcvtdq2ps_avx(auVar13);
  auVar14 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar53 * 0xd + 6)));
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar63 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar53 * 0x12 + 6)));
  auVar63 = vcvtdq2ps_avx(auVar63);
  auVar62 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar53 * 0x13 + 6)));
  auVar62 = vcvtdq2ps_avx(auVar62);
  auVar111 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar53 * 0x14 + 6)));
  auVar111 = vcvtdq2ps_avx(auVar111);
  auVar270._4_4_ = auVar143._0_4_;
  auVar270._0_4_ = auVar143._0_4_;
  auVar270._8_4_ = auVar143._0_4_;
  auVar270._12_4_ = auVar143._0_4_;
  auVar90 = vshufps_avx(auVar143,auVar143,0x55);
  auVar61 = vshufps_avx(auVar143,auVar143,0xaa);
  fVar56 = auVar61._0_4_;
  auVar222._0_4_ = fVar56 * auVar11._0_4_;
  fVar83 = auVar61._4_4_;
  auVar222._4_4_ = fVar83 * auVar11._4_4_;
  fVar59 = auVar61._8_4_;
  auVar222._8_4_ = fVar59 * auVar11._8_4_;
  fVar86 = auVar61._12_4_;
  auVar222._12_4_ = fVar86 * auVar11._12_4_;
  auVar206._0_4_ = auVar14._0_4_ * fVar56;
  auVar206._4_4_ = auVar14._4_4_ * fVar83;
  auVar206._8_4_ = auVar14._8_4_ * fVar59;
  auVar206._12_4_ = auVar14._12_4_ * fVar86;
  auVar178._0_4_ = auVar111._0_4_ * fVar56;
  auVar178._4_4_ = auVar111._4_4_ * fVar83;
  auVar178._8_4_ = auVar111._8_4_ * fVar59;
  auVar178._12_4_ = auVar111._12_4_ * fVar86;
  auVar61 = vfmadd231ps_fma(auVar222,auVar90,auVar9);
  auVar91 = vfmadd231ps_fma(auVar206,auVar90,auVar13);
  auVar90 = vfmadd231ps_fma(auVar178,auVar62,auVar90);
  auVar120 = vfmadd231ps_fma(auVar61,auVar270,auVar105);
  auVar91 = vfmadd231ps_fma(auVar91,auVar270,auVar12);
  auVar133 = vfmadd231ps_fma(auVar90,auVar63,auVar270);
  auVar271._4_4_ = auVar60._0_4_;
  auVar271._0_4_ = auVar60._0_4_;
  auVar271._8_4_ = auVar60._0_4_;
  auVar271._12_4_ = auVar60._0_4_;
  auVar90 = vshufps_avx(auVar60,auVar60,0x55);
  auVar61 = vshufps_avx(auVar60,auVar60,0xaa);
  fVar56 = auVar61._0_4_;
  auVar144._0_4_ = fVar56 * auVar11._0_4_;
  fVar83 = auVar61._4_4_;
  auVar144._4_4_ = fVar83 * auVar11._4_4_;
  fVar59 = auVar61._8_4_;
  auVar144._8_4_ = fVar59 * auVar11._8_4_;
  fVar86 = auVar61._12_4_;
  auVar144._12_4_ = fVar86 * auVar11._12_4_;
  auVar89._0_4_ = auVar14._0_4_ * fVar56;
  auVar89._4_4_ = auVar14._4_4_ * fVar83;
  auVar89._8_4_ = auVar14._8_4_ * fVar59;
  auVar89._12_4_ = auVar14._12_4_ * fVar86;
  auVar61._0_4_ = auVar111._0_4_ * fVar56;
  auVar61._4_4_ = auVar111._4_4_ * fVar83;
  auVar61._8_4_ = auVar111._8_4_ * fVar59;
  auVar61._12_4_ = auVar111._12_4_ * fVar86;
  auVar9 = vfmadd231ps_fma(auVar144,auVar90,auVar9);
  auVar11 = vfmadd231ps_fma(auVar89,auVar90,auVar13);
  auVar13 = vfmadd231ps_fma(auVar61,auVar90,auVar62);
  auVar14 = vfmadd231ps_fma(auVar9,auVar271,auVar105);
  auVar62 = vfmadd231ps_fma(auVar11,auVar271,auVar12);
  auVar111 = vfmadd231ps_fma(auVar13,auVar271,auVar63);
  auVar238._8_4_ = 0x7fffffff;
  auVar238._0_8_ = 0x7fffffff7fffffff;
  auVar238._12_4_ = 0x7fffffff;
  auVar105 = vandps_avx(auVar120,auVar238);
  auVar132._8_4_ = 0x219392ef;
  auVar132._0_8_ = 0x219392ef219392ef;
  auVar132._12_4_ = 0x219392ef;
  auVar105 = vcmpps_avx(auVar105,auVar132,1);
  auVar9 = vblendvps_avx(auVar120,auVar132,auVar105);
  auVar105 = vandps_avx(auVar91,auVar238);
  auVar105 = vcmpps_avx(auVar105,auVar132,1);
  auVar11 = vblendvps_avx(auVar91,auVar132,auVar105);
  auVar105 = vandps_avx(auVar238,auVar133);
  auVar105 = vcmpps_avx(auVar105,auVar132,1);
  auVar105 = vblendvps_avx(auVar133,auVar132,auVar105);
  auVar12 = vrcpps_avx(auVar9);
  auVar179._8_4_ = 0x3f800000;
  auVar179._0_8_ = 0x3f8000003f800000;
  auVar179._12_4_ = 0x3f800000;
  auVar9 = vfnmadd213ps_fma(auVar9,auVar12,auVar179);
  auVar12 = vfmadd132ps_fma(auVar9,auVar12,auVar12);
  auVar9 = vrcpps_avx(auVar11);
  auVar11 = vfnmadd213ps_fma(auVar11,auVar9,auVar179);
  auVar13 = vfmadd132ps_fma(auVar11,auVar9,auVar9);
  auVar9 = vrcpps_avx(auVar105);
  auVar105 = vfnmadd213ps_fma(auVar105,auVar9,auVar179);
  auVar63 = vfmadd132ps_fma(auVar105,auVar9,auVar9);
  auVar105._8_8_ = 0;
  auVar105._0_8_ = *(ulong *)(prim + uVar53 * 7 + 6);
  auVar105 = vpmovsxwd_avx(auVar105);
  auVar105 = vcvtdq2ps_avx(auVar105);
  auVar105 = vsubps_avx(auVar105,auVar14);
  auVar133._0_4_ = auVar12._0_4_ * auVar105._0_4_;
  auVar133._4_4_ = auVar12._4_4_ * auVar105._4_4_;
  auVar133._8_4_ = auVar12._8_4_ * auVar105._8_4_;
  auVar133._12_4_ = auVar12._12_4_ * auVar105._12_4_;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar53 * 9 + 6);
  auVar105 = vpmovsxwd_avx(auVar9);
  auVar105 = vcvtdq2ps_avx(auVar105);
  auVar105 = vsubps_avx(auVar105,auVar14);
  auVar145._0_4_ = auVar12._0_4_ * auVar105._0_4_;
  auVar145._4_4_ = auVar12._4_4_ * auVar105._4_4_;
  auVar145._8_4_ = auVar12._8_4_ * auVar105._8_4_;
  auVar145._12_4_ = auVar12._12_4_ * auVar105._12_4_;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar53 * 0xe + 6);
  auVar105 = vpmovsxwd_avx(auVar11);
  auVar105 = vcvtdq2ps_avx(auVar105);
  auVar105 = vsubps_avx(auVar105,auVar62);
  auVar158._0_4_ = auVar13._0_4_ * auVar105._0_4_;
  auVar158._4_4_ = auVar13._4_4_ * auVar105._4_4_;
  auVar158._8_4_ = auVar13._8_4_ * auVar105._8_4_;
  auVar158._12_4_ = auVar13._12_4_ * auVar105._12_4_;
  auVar91._1_3_ = 0;
  auVar91[0] = PVar3;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + 6);
  auVar105 = vpmovsxwd_avx(auVar12);
  auVar105 = vcvtdq2ps_avx(auVar105);
  auVar105 = vsubps_avx(auVar105,auVar62);
  auVar90._0_4_ = auVar13._0_4_ * auVar105._0_4_;
  auVar90._4_4_ = auVar13._4_4_ * auVar105._4_4_;
  auVar90._8_4_ = auVar13._8_4_ * auVar105._8_4_;
  auVar90._12_4_ = auVar13._12_4_ * auVar105._12_4_;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar53 * 0x15 + 6);
  auVar105 = vpmovsxwd_avx(auVar13);
  auVar105 = vcvtdq2ps_avx(auVar105);
  auVar105 = vsubps_avx(auVar105,auVar111);
  auVar120._0_4_ = auVar63._0_4_ * auVar105._0_4_;
  auVar120._4_4_ = auVar63._4_4_ * auVar105._4_4_;
  auVar120._8_4_ = auVar63._8_4_ * auVar105._8_4_;
  auVar120._12_4_ = auVar63._12_4_ * auVar105._12_4_;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar53 * 0x17 + 6);
  auVar105 = vpmovsxwd_avx(auVar14);
  auVar105 = vcvtdq2ps_avx(auVar105);
  auVar105 = vsubps_avx(auVar105,auVar111);
  auVar62._0_4_ = auVar63._0_4_ * auVar105._0_4_;
  auVar62._4_4_ = auVar63._4_4_ * auVar105._4_4_;
  auVar62._8_4_ = auVar63._8_4_ * auVar105._8_4_;
  auVar62._12_4_ = auVar63._12_4_ * auVar105._12_4_;
  auVar105 = vpminsd_avx(auVar133,auVar145);
  auVar9 = vpminsd_avx(auVar158,auVar90);
  auVar105 = vmaxps_avx(auVar105,auVar9);
  auVar9 = vpminsd_avx(auVar120,auVar62);
  uVar52 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar207._4_4_ = uVar52;
  auVar207._0_4_ = uVar52;
  auVar207._8_4_ = uVar52;
  auVar207._12_4_ = uVar52;
  auVar9 = vmaxps_avx(auVar9,auVar207);
  auVar105 = vmaxps_avx(auVar105,auVar9);
  auVar196._0_4_ = auVar105._0_4_ * 0.99999964;
  auVar196._4_4_ = auVar105._4_4_ * 0.99999964;
  auVar196._8_4_ = auVar105._8_4_ * 0.99999964;
  auVar196._12_4_ = auVar105._12_4_ * 0.99999964;
  auVar105 = vpmaxsd_avx(auVar133,auVar145);
  auVar9 = vpmaxsd_avx(auVar158,auVar90);
  auVar105 = vminps_avx(auVar105,auVar9);
  auVar9 = vpmaxsd_avx(auVar120,auVar62);
  uVar52 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar111._4_4_ = uVar52;
  auVar111._0_4_ = uVar52;
  auVar111._8_4_ = uVar52;
  auVar111._12_4_ = uVar52;
  auVar9 = vminps_avx(auVar9,auVar111);
  auVar105 = vminps_avx(auVar105,auVar9);
  auVar63._0_4_ = auVar105._0_4_ * 1.0000004;
  auVar63._4_4_ = auVar105._4_4_ * 1.0000004;
  auVar63._8_4_ = auVar105._8_4_ * 1.0000004;
  auVar63._12_4_ = auVar105._12_4_ * 1.0000004;
  auVar91[4] = PVar3;
  auVar91._5_3_ = 0;
  auVar91[8] = PVar3;
  auVar91._9_3_ = 0;
  auVar91[0xc] = PVar3;
  auVar91._13_3_ = 0;
  auVar9 = vpcmpgtd_avx(auVar91,_DAT_01f4ad30);
  auVar105 = vcmpps_avx(auVar196,auVar63,2);
  auVar105 = vandps_avx(auVar105,auVar9);
  uVar52 = vmovmskps_avx(auVar105);
  uVar53 = CONCAT44((int)((ulong)unaff_RBP >> 0x20),uVar52);
  auVar80._16_16_ = mm_lookupmask_ps._240_16_;
  auVar80._0_16_ = mm_lookupmask_ps._240_16_;
  local_1b8 = vblendps_avx(auVar80,ZEXT832(0) << 0x20,0x80);
  local_510 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
LAB_01107ee9:
  if (uVar53 == 0) {
    return;
  }
  lVar49 = 0;
  for (uVar55 = uVar53; (uVar55 & 1) == 0; uVar55 = uVar55 >> 1 | 0x8000000000000000) {
    lVar49 = lVar49 + 1;
  }
  uVar48 = *(uint *)(prim + 2);
  uVar4 = *(uint *)(prim + lVar49 * 4 + 6);
  pGVar5 = (context->scene->geometries).items[uVar48].ptr;
  uVar55 = (ulong)*(uint *)(*(long *)&pGVar5->field_0x58 +
                           pGVar5[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)uVar4);
  p_Var6 = pGVar5[1].intersectionFilterN;
  pvVar7 = pGVar5[2].userPtr;
  _Var8 = pGVar5[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar105 = *(undefined1 (*) [16])(_Var8 + uVar55 * (long)pvVar7);
  auVar9 = *(undefined1 (*) [16])(_Var8 + (uVar55 + 1) * (long)pvVar7);
  auVar11 = *(undefined1 (*) [16])(_Var8 + (uVar55 + 2) * (long)pvVar7);
  auVar12 = *(undefined1 (*) [16])(_Var8 + (long)pvVar7 * (uVar55 + 3));
  lVar49 = *(long *)&pGVar5[1].time_range.upper;
  auVar13 = *(undefined1 (*) [16])(lVar49 + (long)p_Var6 * uVar55);
  auVar14 = *(undefined1 (*) [16])(lVar49 + (long)p_Var6 * (uVar55 + 1));
  auVar63 = *(undefined1 (*) [16])(lVar49 + (long)p_Var6 * (uVar55 + 2));
  uVar53 = uVar53 - 1 & uVar53;
  auVar62 = *(undefined1 (*) [16])(lVar49 + (long)p_Var6 * (uVar55 + 3));
  if (uVar53 != 0) {
    uVar54 = uVar53 - 1 & uVar53;
    for (uVar55 = uVar53; (uVar55 & 1) == 0; uVar55 = uVar55 >> 1 | 0x8000000000000000) {
    }
    if (uVar54 != 0) {
      for (; (uVar54 & 1) == 0; uVar54 = uVar54 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar111 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x1c);
  auVar111 = vinsertps_avx(auVar111,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  auVar133 = ZEXT816(0) << 0x40;
  auVar92._0_4_ = auVar62._0_4_ * 0.0;
  auVar92._4_4_ = auVar62._4_4_ * 0.0;
  auVar92._8_4_ = auVar62._8_4_ * 0.0;
  auVar92._12_4_ = auVar62._12_4_ * 0.0;
  auVar61 = vfmadd231ps_fma(auVar92,auVar63,auVar133);
  auVar90 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar14,auVar61);
  local_668._0_4_ = auVar13._0_4_ + auVar90._0_4_;
  local_668._4_4_ = auVar13._4_4_ + auVar90._4_4_;
  uStack_660._0_4_ = auVar13._8_4_ + auVar90._8_4_;
  uStack_660._4_4_ = auVar13._12_4_ + auVar90._12_4_;
  auVar272._8_4_ = 0x40400000;
  auVar272._0_8_ = 0x4040000040400000;
  auVar272._12_4_ = 0x40400000;
  auVar90 = vfmadd231ps_fma(auVar61,auVar14,auVar272);
  auVar91 = vfnmadd231ps_fma(auVar90,auVar13,auVar272);
  auVar244._0_4_ = auVar12._0_4_ * 0.0;
  auVar244._4_4_ = auVar12._4_4_ * 0.0;
  auVar244._8_4_ = auVar12._8_4_ * 0.0;
  auVar244._12_4_ = auVar12._12_4_ * 0.0;
  auVar61 = vfmadd231ps_fma(auVar244,auVar11,auVar133);
  auVar90 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar9,auVar61);
  auVar256._0_4_ = auVar105._0_4_ + auVar90._0_4_;
  auVar256._4_4_ = auVar105._4_4_ + auVar90._4_4_;
  auVar256._8_4_ = auVar105._8_4_ + auVar90._8_4_;
  auVar256._12_4_ = auVar105._12_4_ + auVar90._12_4_;
  auVar90 = vfmadd231ps_fma(auVar61,auVar9,auVar272);
  auVar120 = vfnmadd231ps_fma(auVar90,auVar105,auVar272);
  auVar90 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar63,auVar62);
  auVar90 = vfmadd231ps_fma(auVar90,auVar14,auVar133);
  auVar61 = vfmadd231ps_fma(auVar90,auVar13,auVar133);
  auVar134._0_4_ = auVar62._0_4_ * 3.0;
  auVar134._4_4_ = auVar62._4_4_ * 3.0;
  auVar134._8_4_ = auVar62._8_4_ * 3.0;
  auVar134._12_4_ = auVar62._12_4_ * 3.0;
  auVar63 = vfnmadd231ps_fma(auVar134,auVar272,auVar63);
  auVar14 = vfmadd231ps_fma(auVar63,auVar133,auVar14);
  auVar63 = vfnmadd231ps_fma(auVar14,auVar133,auVar13);
  auVar13 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar11,auVar12);
  auVar13 = vfmadd231ps_fma(auVar13,auVar9,auVar133);
  auVar13 = vfmadd231ps_fma(auVar13,auVar105,auVar133);
  auVar223._0_4_ = auVar12._0_4_ * 3.0;
  auVar223._4_4_ = auVar12._4_4_ * 3.0;
  auVar223._8_4_ = auVar12._8_4_ * 3.0;
  auVar223._12_4_ = auVar12._12_4_ * 3.0;
  auVar11 = vfnmadd231ps_fma(auVar223,auVar272,auVar11);
  auVar9 = vfmadd231ps_fma(auVar11,auVar133,auVar9);
  auVar62 = vfnmadd231ps_fma(auVar9,auVar133,auVar105);
  auVar105 = vshufps_avx(auVar91,auVar91,0xc9);
  auVar9 = vshufps_avx(auVar256,auVar256,0xc9);
  fVar119 = auVar91._0_4_;
  auVar159._0_4_ = fVar119 * auVar9._0_4_;
  fVar84 = auVar91._4_4_;
  auVar159._4_4_ = fVar84 * auVar9._4_4_;
  fVar85 = auVar91._8_4_;
  auVar159._8_4_ = fVar85 * auVar9._8_4_;
  fVar58 = auVar91._12_4_;
  auVar159._12_4_ = fVar58 * auVar9._12_4_;
  auVar9 = vfmsub231ps_fma(auVar159,auVar105,auVar256);
  auVar11 = vshufps_avx(auVar9,auVar9,0xc9);
  auVar9 = vshufps_avx(auVar120,auVar120,0xc9);
  auVar160._0_4_ = fVar119 * auVar9._0_4_;
  auVar160._4_4_ = fVar84 * auVar9._4_4_;
  auVar160._8_4_ = fVar85 * auVar9._8_4_;
  auVar160._12_4_ = fVar58 * auVar9._12_4_;
  auVar105 = vfmsub231ps_fma(auVar160,auVar105,auVar120);
  auVar12 = vshufps_avx(auVar105,auVar105,0xc9);
  auVar9 = vshufps_avx(auVar63,auVar63,0xc9);
  auVar105 = vshufps_avx(auVar13,auVar13,0xc9);
  fVar57 = auVar63._0_4_;
  auVar146._0_4_ = fVar57 * auVar105._0_4_;
  fVar221 = auVar63._4_4_;
  auVar146._4_4_ = fVar221 * auVar105._4_4_;
  fVar131 = auVar63._8_4_;
  auVar146._8_4_ = fVar131 * auVar105._8_4_;
  fVar142 = auVar63._12_4_;
  auVar146._12_4_ = fVar142 * auVar105._12_4_;
  auVar105 = vfmsub231ps_fma(auVar146,auVar9,auVar13);
  auVar13 = vshufps_avx(auVar105,auVar105,0xc9);
  auVar14 = vshufps_avx(auVar62,auVar62,0xc9);
  auVar105 = vdpps_avx(auVar11,auVar11,0x7f);
  auVar180._0_4_ = fVar57 * auVar14._0_4_;
  auVar180._4_4_ = fVar221 * auVar14._4_4_;
  auVar180._8_4_ = fVar131 * auVar14._8_4_;
  auVar180._12_4_ = fVar142 * auVar14._12_4_;
  auVar9 = vfmsub231ps_fma(auVar180,auVar9,auVar62);
  auVar14 = vshufps_avx(auVar9,auVar9,0xc9);
  fVar83 = auVar105._0_4_;
  auVar224._4_12_ = ZEXT812(0) << 0x20;
  auVar224._0_4_ = fVar83;
  auVar9 = vrsqrtss_avx(auVar224,auVar224);
  fVar56 = auVar9._0_4_;
  fVar59 = fVar56 * 1.5 - fVar83 * 0.5 * fVar56 * fVar56 * fVar56;
  auVar9 = vdpps_avx(auVar11,auVar12,0x7f);
  fVar157 = auVar11._0_4_ * fVar59;
  fVar175 = auVar11._4_4_ * fVar59;
  fVar176 = auVar11._8_4_ * fVar59;
  fVar177 = auVar11._12_4_ * fVar59;
  auVar239._0_4_ = auVar12._0_4_ * fVar83;
  auVar239._4_4_ = auVar12._4_4_ * fVar83;
  auVar239._8_4_ = auVar12._8_4_ * fVar83;
  auVar239._12_4_ = auVar12._12_4_ * fVar83;
  fVar56 = auVar9._0_4_;
  auVar197._0_4_ = auVar11._0_4_ * fVar56;
  auVar197._4_4_ = auVar11._4_4_ * fVar56;
  auVar197._8_4_ = auVar11._8_4_ * fVar56;
  auVar197._12_4_ = auVar11._12_4_ * fVar56;
  auVar11 = vsubps_avx(auVar239,auVar197);
  auVar9 = vrcpss_avx(auVar224,auVar224);
  auVar105 = vfnmadd213ss_fma(auVar105,auVar9,SUB6416(ZEXT464(0x40000000),0));
  fVar56 = auVar9._0_4_ * auVar105._0_4_;
  auVar105 = vdpps_avx(auVar13,auVar13,0x7f);
  fVar83 = auVar105._0_4_;
  auVar225._4_12_ = ZEXT812(0) << 0x20;
  auVar225._0_4_ = fVar83;
  auVar9 = vrsqrtss_avx(auVar225,auVar225);
  fVar86 = auVar9._0_4_;
  fVar86 = fVar86 * 1.5 - fVar83 * 0.5 * fVar86 * fVar86 * fVar86;
  auVar9 = vdpps_avx(auVar13,auVar14,0x7f);
  fVar255 = fVar86 * auVar13._0_4_;
  fVar267 = fVar86 * auVar13._4_4_;
  fVar268 = fVar86 * auVar13._8_4_;
  fVar269 = fVar86 * auVar13._12_4_;
  auVar181._0_4_ = fVar83 * auVar14._0_4_;
  auVar181._4_4_ = fVar83 * auVar14._4_4_;
  auVar181._8_4_ = fVar83 * auVar14._8_4_;
  auVar181._12_4_ = fVar83 * auVar14._12_4_;
  fVar83 = auVar9._0_4_;
  auVar123._0_4_ = fVar83 * auVar13._0_4_;
  auVar123._4_4_ = fVar83 * auVar13._4_4_;
  auVar123._8_4_ = fVar83 * auVar13._8_4_;
  auVar123._12_4_ = fVar83 * auVar13._12_4_;
  auVar12 = vsubps_avx(auVar181,auVar123);
  auVar9 = vrcpss_avx(auVar225,auVar225);
  auVar105 = vfnmadd213ss_fma(auVar105,auVar9,ZEXT416(0x40000000));
  fVar83 = auVar105._0_4_ * auVar9._0_4_;
  auVar105 = vshufps_avx(_local_668,_local_668,0xff);
  auVar208._0_4_ = auVar105._0_4_ * fVar157;
  auVar208._4_4_ = auVar105._4_4_ * fVar175;
  auVar208._8_4_ = auVar105._8_4_ * fVar176;
  auVar208._12_4_ = auVar105._12_4_ * fVar177;
  auVar62 = vsubps_avx(_local_668,auVar208);
  auVar9 = vshufps_avx(auVar91,auVar91,0xff);
  auVar161._0_4_ = auVar9._0_4_ * fVar157 + fVar59 * auVar11._0_4_ * fVar56 * auVar105._0_4_;
  auVar161._4_4_ = auVar9._4_4_ * fVar175 + fVar59 * auVar11._4_4_ * fVar56 * auVar105._4_4_;
  auVar161._8_4_ = auVar9._8_4_ * fVar176 + fVar59 * auVar11._8_4_ * fVar56 * auVar105._8_4_;
  auVar161._12_4_ = auVar9._12_4_ * fVar177 + fVar59 * auVar11._12_4_ * fVar56 * auVar105._12_4_;
  auVar11 = vsubps_avx(auVar91,auVar161);
  auVar226._0_4_ = auVar208._0_4_ + (float)local_668._0_4_;
  auVar226._4_4_ = auVar208._4_4_ + (float)local_668._4_4_;
  auVar226._8_4_ = auVar208._8_4_ + (float)uStack_660;
  auVar226._12_4_ = auVar208._12_4_ + uStack_660._4_4_;
  auVar105 = vshufps_avx(auVar61,auVar61,0xff);
  auVar240._0_4_ = fVar255 * auVar105._0_4_;
  auVar240._4_4_ = fVar267 * auVar105._4_4_;
  auVar240._8_4_ = fVar268 * auVar105._8_4_;
  auVar240._12_4_ = fVar269 * auVar105._12_4_;
  auVar90 = vsubps_avx(auVar61,auVar240);
  auVar9 = vshufps_avx(auVar63,auVar63,0xff);
  auVar247._0_4_ = fVar255 * auVar9._0_4_ + auVar105._0_4_ * fVar86 * auVar12._0_4_ * fVar83;
  auVar247._4_4_ = fVar267 * auVar9._4_4_ + auVar105._4_4_ * fVar86 * auVar12._4_4_ * fVar83;
  auVar247._8_4_ = fVar268 * auVar9._8_4_ + auVar105._8_4_ * fVar86 * auVar12._8_4_ * fVar83;
  auVar247._12_4_ = fVar269 * auVar9._12_4_ + auVar105._12_4_ * fVar86 * auVar12._12_4_ * fVar83;
  auVar105 = vsubps_avx(auVar63,auVar247);
  fVar157 = auVar61._0_4_ + auVar240._0_4_;
  fVar175 = auVar61._4_4_ + auVar240._4_4_;
  fVar176 = auVar61._8_4_ + auVar240._8_4_;
  fVar177 = auVar61._12_4_ + auVar240._12_4_;
  auVar121._0_4_ = auVar62._0_4_ + auVar11._0_4_ * 0.33333334;
  auVar121._4_4_ = auVar62._4_4_ + auVar11._4_4_ * 0.33333334;
  auVar121._8_4_ = auVar62._8_4_ + auVar11._8_4_ * 0.33333334;
  auVar121._12_4_ = auVar62._12_4_ + auVar11._12_4_ * 0.33333334;
  auVar93._0_4_ = auVar105._0_4_ * 0.33333334;
  auVar93._4_4_ = auVar105._4_4_ * 0.33333334;
  auVar93._8_4_ = auVar105._8_4_ * 0.33333334;
  auVar93._12_4_ = auVar105._12_4_ * 0.33333334;
  auVar61 = vsubps_avx(auVar90,auVar93);
  auVar91 = vsubps_avx(auVar62,auVar111);
  auVar105 = vshufps_avx(auVar91,auVar91,0x55);
  auVar9 = vshufps_avx(auVar91,auVar91,0xaa);
  aVar2 = pre->ray_space[k].vy.field_0;
  fVar56 = pre->ray_space[k].vz.field_0.m128[0];
  fVar83 = pre->ray_space[k].vz.field_0.m128[1];
  fVar59 = pre->ray_space[k].vz.field_0.m128[2];
  fVar86 = pre->ray_space[k].vz.field_0.m128[3];
  auVar94._0_4_ = fVar56 * auVar9._0_4_;
  auVar94._4_4_ = fVar83 * auVar9._4_4_;
  auVar94._8_4_ = fVar59 * auVar9._8_4_;
  auVar94._12_4_ = fVar86 * auVar9._12_4_;
  auVar11 = vfmadd231ps_fma(auVar94,(undefined1  [16])aVar2,auVar105);
  auVar120 = vsubps_avx(auVar121,auVar111);
  auVar105 = vshufps_avx(auVar120,auVar120,0x55);
  auVar9 = vshufps_avx(auVar120,auVar120,0xaa);
  auVar278._0_4_ = fVar56 * auVar9._0_4_;
  auVar278._4_4_ = fVar83 * auVar9._4_4_;
  auVar278._8_4_ = fVar59 * auVar9._8_4_;
  auVar278._12_4_ = fVar86 * auVar9._12_4_;
  auVar9 = vfmadd231ps_fma(auVar278,(undefined1  [16])aVar2,auVar105);
  auVar133 = vsubps_avx(auVar61,auVar111);
  auVar105 = vshufps_avx(auVar133,auVar133,0xaa);
  auVar245._0_4_ = fVar56 * auVar105._0_4_;
  auVar245._4_4_ = fVar83 * auVar105._4_4_;
  auVar245._8_4_ = fVar59 * auVar105._8_4_;
  auVar245._12_4_ = fVar86 * auVar105._12_4_;
  auVar105 = vshufps_avx(auVar133,auVar133,0x55);
  auVar12 = vfmadd231ps_fma(auVar245,(undefined1  [16])aVar2,auVar105);
  auVar60 = vsubps_avx(auVar90,auVar111);
  auVar105 = vshufps_avx(auVar60,auVar60,0xaa);
  auVar257._0_4_ = fVar56 * auVar105._0_4_;
  auVar257._4_4_ = fVar83 * auVar105._4_4_;
  auVar257._8_4_ = fVar59 * auVar105._8_4_;
  auVar257._12_4_ = fVar86 * auVar105._12_4_;
  auVar105 = vshufps_avx(auVar60,auVar60,0x55);
  auVar13 = vfmadd231ps_fma(auVar257,(undefined1  [16])aVar2,auVar105);
  auVar89 = vsubps_avx(auVar226,auVar111);
  auVar105 = vshufps_avx(auVar89,auVar89,0xaa);
  auVar147._0_4_ = fVar56 * auVar105._0_4_;
  auVar147._4_4_ = fVar83 * auVar105._4_4_;
  auVar147._8_4_ = fVar59 * auVar105._8_4_;
  auVar147._12_4_ = fVar86 * auVar105._12_4_;
  auVar105 = vshufps_avx(auVar89,auVar89,0x55);
  auVar14 = vfmadd231ps_fma(auVar147,(undefined1  [16])aVar2,auVar105);
  auVar64._0_4_ = (fVar119 + auVar161._0_4_) * 0.33333334 + auVar226._0_4_;
  auVar64._4_4_ = (fVar84 + auVar161._4_4_) * 0.33333334 + auVar226._4_4_;
  auVar64._8_4_ = (fVar85 + auVar161._8_4_) * 0.33333334 + auVar226._8_4_;
  auVar64._12_4_ = (fVar58 + auVar161._12_4_) * 0.33333334 + auVar226._12_4_;
  auVar132 = vsubps_avx(auVar64,auVar111);
  auVar105 = vshufps_avx(auVar132,auVar132,0xaa);
  auVar198._0_4_ = auVar105._0_4_ * fVar56;
  auVar198._4_4_ = auVar105._4_4_ * fVar83;
  auVar198._8_4_ = auVar105._8_4_ * fVar59;
  auVar198._12_4_ = auVar105._12_4_ * fVar86;
  auVar105 = vshufps_avx(auVar132,auVar132,0x55);
  auVar63 = vfmadd231ps_fma(auVar198,(undefined1  [16])aVar2,auVar105);
  auVar209._0_4_ = (fVar57 + auVar247._0_4_) * 0.33333334;
  auVar209._4_4_ = (fVar221 + auVar247._4_4_) * 0.33333334;
  auVar209._8_4_ = (fVar131 + auVar247._8_4_) * 0.33333334;
  auVar209._12_4_ = (fVar142 + auVar247._12_4_) * 0.33333334;
  auVar15._4_4_ = fVar175;
  auVar15._0_4_ = fVar157;
  auVar15._8_4_ = fVar176;
  auVar15._12_4_ = fVar177;
  auVar143 = vsubps_avx(auVar15,auVar209);
  auVar144 = vsubps_avx(auVar143,auVar111);
  auVar105 = vshufps_avx(auVar144,auVar144,0xaa);
  auVar210._0_4_ = auVar105._0_4_ * fVar56;
  auVar210._4_4_ = auVar105._4_4_ * fVar83;
  auVar210._8_4_ = auVar105._8_4_ * fVar59;
  auVar210._12_4_ = auVar105._12_4_ * fVar86;
  auVar105 = vshufps_avx(auVar144,auVar144,0x55);
  auVar145 = vfmadd231ps_fma(auVar210,(undefined1  [16])aVar2,auVar105);
  auVar111 = vsubps_avx(auVar15,auVar111);
  auVar105 = vshufps_avx(auVar111,auVar111,0xaa);
  auVar65._0_4_ = fVar56 * auVar105._0_4_;
  auVar65._4_4_ = fVar83 * auVar105._4_4_;
  auVar65._8_4_ = fVar59 * auVar105._8_4_;
  auVar65._12_4_ = fVar86 * auVar105._12_4_;
  auVar105 = vshufps_avx(auVar111,auVar111,0x55);
  auVar105 = vfmadd231ps_fma(auVar65,(undefined1  [16])aVar2,auVar105);
  local_418 = auVar91._0_4_;
  auVar162._4_4_ = local_418;
  auVar162._0_4_ = local_418;
  auVar162._8_4_ = local_418;
  auVar162._12_4_ = local_418;
  aVar2 = pre->ray_space[k].vx.field_0;
  auVar158 = vfmadd231ps_fma(auVar11,(undefined1  [16])aVar2,auVar162);
  local_428 = auVar120._0_4_;
  auVar163._4_4_ = local_428;
  auVar163._0_4_ = local_428;
  auVar163._8_4_ = local_428;
  auVar163._12_4_ = local_428;
  auVar178 = vfmadd231ps_fma(auVar9,(undefined1  [16])aVar2,auVar163);
  uVar52 = auVar133._0_4_;
  auVar164._4_4_ = uVar52;
  auVar164._0_4_ = uVar52;
  auVar164._8_4_ = uVar52;
  auVar164._12_4_ = uVar52;
  auVar179 = vfmadd231ps_fma(auVar12,(undefined1  [16])aVar2,auVar164);
  uVar52 = auVar60._0_4_;
  auVar165._4_4_ = uVar52;
  auVar165._0_4_ = uVar52;
  auVar165._8_4_ = uVar52;
  auVar165._12_4_ = uVar52;
  auVar206 = vfmadd231ps_fma(auVar13,(undefined1  [16])aVar2,auVar165);
  uVar52 = auVar89._0_4_;
  auVar166._4_4_ = uVar52;
  auVar166._0_4_ = uVar52;
  auVar166._8_4_ = uVar52;
  auVar166._12_4_ = uVar52;
  auVar207 = vfmadd231ps_fma(auVar14,(undefined1  [16])aVar2,auVar166);
  uVar52 = auVar132._0_4_;
  auVar167._4_4_ = uVar52;
  auVar167._0_4_ = uVar52;
  auVar167._8_4_ = uVar52;
  auVar167._12_4_ = uVar52;
  auVar222 = vfmadd231ps_fma(auVar63,(undefined1  [16])aVar2,auVar167);
  uVar52 = auVar144._0_4_;
  auVar168._4_4_ = uVar52;
  auVar168._0_4_ = uVar52;
  auVar168._8_4_ = uVar52;
  auVar168._12_4_ = uVar52;
  auVar270 = vfmadd231ps_fma(auVar145,(undefined1  [16])aVar2,auVar168);
  uVar52 = auVar111._0_4_;
  auVar169._4_4_ = uVar52;
  auVar169._0_4_ = uVar52;
  auVar169._8_4_ = uVar52;
  auVar169._12_4_ = uVar52;
  auVar271 = vfmadd231ps_fma(auVar105,(undefined1  [16])aVar2,auVar169);
  auVar12 = vmovlhps_avx(auVar158,auVar207);
  auVar13 = vmovlhps_avx(auVar178,auVar222);
  auVar14 = vmovlhps_avx(auVar179,auVar270);
  auVar63 = vmovlhps_avx(auVar206,auVar271);
  auVar105 = vminps_avx(auVar12,auVar13);
  auVar9 = vminps_avx(auVar14,auVar63);
  auVar11 = vminps_avx(auVar105,auVar9);
  auVar105 = vmaxps_avx(auVar12,auVar13);
  auVar9 = vmaxps_avx(auVar14,auVar63);
  auVar105 = vmaxps_avx(auVar105,auVar9);
  auVar9 = vshufpd_avx(auVar11,auVar11,3);
  auVar11 = vminps_avx(auVar11,auVar9);
  auVar9 = vshufpd_avx(auVar105,auVar105,3);
  auVar9 = vmaxps_avx(auVar105,auVar9);
  auVar105 = vandps_avx(auVar238,auVar11);
  auVar9 = vandps_avx(auVar238,auVar9);
  auVar105 = vmaxps_avx(auVar105,auVar9);
  auVar9 = vmovshdup_avx(auVar105);
  auVar105 = vmaxss_avx(auVar9,auVar105);
  fVar83 = auVar105._0_4_ * 9.536743e-07;
  auVar182._8_8_ = auVar158._0_8_;
  auVar182._0_8_ = auVar158._0_8_;
  auVar227._8_8_ = auVar178._0_8_;
  auVar227._0_8_ = auVar178._0_8_;
  auVar246._0_8_ = auVar179._0_8_;
  auVar246._8_8_ = auVar246._0_8_;
  auVar258._0_8_ = auVar206._0_8_;
  auVar258._8_8_ = auVar258._0_8_;
  local_78 = fVar83;
  fStack_74 = fVar83;
  fStack_70 = fVar83;
  fStack_6c = fVar83;
  fStack_68 = fVar83;
  fStack_64 = fVar83;
  fStack_60 = fVar83;
  fStack_5c = fVar83;
  fStack_90 = -fVar83;
  local_98 = -fVar83;
  fStack_94 = -fVar83;
  fStack_8c = fStack_90;
  fStack_88 = fStack_90;
  fStack_84 = fStack_90;
  fStack_80 = fStack_90;
  fStack_7c = fStack_90;
  uVar55 = 0;
  fVar56 = *(float *)(ray + k * 4 + 0x30);
  auVar9 = vsubps_avx(auVar13,auVar12);
  auVar11 = vsubps_avx(auVar14,auVar13);
  auVar145 = vsubps_avx(auVar63,auVar14);
  auVar158 = vsubps_avx(auVar226,auVar62);
  auVar178 = vsubps_avx(auVar64,auVar121);
  auVar179 = vsubps_avx(auVar143,auVar61);
  auVar126._4_4_ = fVar175;
  auVar126._0_4_ = fVar157;
  auVar126._8_4_ = fVar176;
  auVar126._12_4_ = fVar177;
  auVar206 = vsubps_avx(auVar126,auVar90);
  auVar66 = ZEXT816(0x3f80000000000000);
  auVar105 = auVar66;
LAB_01108695:
  auVar15 = vshufps_avx(auVar66,auVar66,0x50);
  auVar279._8_4_ = 0x3f800000;
  auVar279._0_8_ = 0x3f8000003f800000;
  auVar279._12_4_ = 0x3f800000;
  auVar282._16_4_ = 0x3f800000;
  auVar282._0_16_ = auVar279;
  auVar282._20_4_ = 0x3f800000;
  auVar282._24_4_ = 0x3f800000;
  auVar282._28_4_ = 0x3f800000;
  auVar126 = vsubps_avx(auVar279,auVar15);
  fVar59 = auVar15._0_4_;
  fVar131 = auVar207._0_4_;
  auVar67._0_4_ = fVar131 * fVar59;
  fVar86 = auVar15._4_4_;
  fVar142 = auVar207._4_4_;
  auVar67._4_4_ = fVar142 * fVar86;
  fVar119 = auVar15._8_4_;
  auVar67._8_4_ = fVar131 * fVar119;
  fVar84 = auVar15._12_4_;
  auVar67._12_4_ = fVar142 * fVar84;
  fVar255 = auVar222._0_4_;
  auVar170._0_4_ = fVar255 * fVar59;
  fVar267 = auVar222._4_4_;
  auVar170._4_4_ = fVar267 * fVar86;
  auVar170._8_4_ = fVar255 * fVar119;
  auVar170._12_4_ = fVar267 * fVar84;
  fVar195 = auVar270._0_4_;
  auVar135._0_4_ = fVar195 * fVar59;
  fVar204 = auVar270._4_4_;
  auVar135._4_4_ = fVar204 * fVar86;
  auVar135._8_4_ = fVar195 * fVar119;
  auVar135._12_4_ = fVar204 * fVar84;
  fVar205 = auVar271._0_4_;
  auVar112._0_4_ = fVar205 * fVar59;
  fVar220 = auVar271._4_4_;
  auVar112._4_4_ = fVar220 * fVar86;
  auVar112._8_4_ = fVar205 * fVar119;
  auVar112._12_4_ = fVar220 * fVar84;
  auVar247 = vfmadd231ps_fma(auVar67,auVar126,auVar182);
  auVar93 = vfmadd231ps_fma(auVar170,auVar126,auVar227);
  auVar94 = vfmadd231ps_fma(auVar135,auVar126,auVar246);
  auVar240 = vfmadd231ps_fma(auVar112,auVar258,auVar126);
  auVar15 = vmovshdup_avx(auVar105);
  fVar59 = auVar105._0_4_;
  fStack_140 = (auVar15._0_4_ - fVar59) * 0.04761905;
  auVar218._4_4_ = fVar59;
  auVar218._0_4_ = fVar59;
  auVar218._8_4_ = fVar59;
  auVar218._12_4_ = fVar59;
  auVar218._16_4_ = fVar59;
  auVar218._20_4_ = fVar59;
  auVar218._24_4_ = fVar59;
  auVar218._28_4_ = fVar59;
  auVar106._0_8_ = auVar15._0_8_;
  auVar106._8_8_ = auVar106._0_8_;
  auVar106._16_8_ = auVar106._0_8_;
  auVar106._24_8_ = auVar106._0_8_;
  auVar80 = vsubps_avx(auVar106,auVar218);
  uVar52 = auVar247._0_4_;
  auVar276._4_4_ = uVar52;
  auVar276._0_4_ = uVar52;
  auVar276._8_4_ = uVar52;
  auVar276._12_4_ = uVar52;
  auVar276._16_4_ = uVar52;
  auVar276._20_4_ = uVar52;
  auVar276._24_4_ = uVar52;
  auVar276._28_4_ = uVar52;
  auVar15 = vmovshdup_avx(auVar247);
  uVar88 = auVar15._0_8_;
  auVar266._8_8_ = uVar88;
  auVar266._0_8_ = uVar88;
  auVar266._16_8_ = uVar88;
  auVar266._24_8_ = uVar88;
  fVar268 = auVar93._0_4_;
  auVar252._4_4_ = fVar268;
  auVar252._0_4_ = fVar268;
  auVar252._8_4_ = fVar268;
  auVar252._12_4_ = fVar268;
  auVar252._16_4_ = fVar268;
  auVar252._20_4_ = fVar268;
  auVar252._24_4_ = fVar268;
  auVar252._28_4_ = fVar268;
  auVar126 = vmovshdup_avx(auVar93);
  auVar107._0_8_ = auVar126._0_8_;
  auVar107._8_8_ = auVar107._0_8_;
  auVar107._16_8_ = auVar107._0_8_;
  auVar107._24_8_ = auVar107._0_8_;
  fVar221 = auVar94._0_4_;
  auVar187._4_4_ = fVar221;
  auVar187._0_4_ = fVar221;
  auVar187._8_4_ = fVar221;
  auVar187._12_4_ = fVar221;
  auVar187._16_4_ = fVar221;
  auVar187._20_4_ = fVar221;
  auVar187._24_4_ = fVar221;
  auVar187._28_4_ = fVar221;
  auVar65 = vmovshdup_avx(auVar94);
  auVar202._0_8_ = auVar65._0_8_;
  auVar202._8_8_ = auVar202._0_8_;
  auVar202._16_8_ = auVar202._0_8_;
  auVar202._24_8_ = auVar202._0_8_;
  fVar57 = auVar240._0_4_;
  auVar92 = vmovshdup_avx(auVar240);
  auVar134 = vfmadd132ps_fma(auVar80,auVar218,_DAT_01f7b040);
  auVar80 = vsubps_avx(auVar282,ZEXT1632(auVar134));
  fVar59 = auVar134._0_4_;
  fVar86 = auVar134._4_4_;
  auVar16._4_4_ = fVar268 * fVar86;
  auVar16._0_4_ = fVar268 * fVar59;
  fVar119 = auVar134._8_4_;
  auVar16._8_4_ = fVar268 * fVar119;
  fVar84 = auVar134._12_4_;
  auVar16._12_4_ = fVar268 * fVar84;
  auVar16._16_4_ = fVar268 * 0.0;
  auVar16._20_4_ = fVar268 * 0.0;
  auVar16._24_4_ = fVar268 * 0.0;
  auVar16._28_4_ = 0x3f800000;
  auVar134 = vfmadd231ps_fma(auVar16,auVar80,auVar276);
  fVar85 = auVar126._0_4_;
  fVar58 = auVar126._4_4_;
  auVar17._4_4_ = fVar58 * fVar86;
  auVar17._0_4_ = fVar85 * fVar59;
  auVar17._8_4_ = fVar85 * fVar119;
  auVar17._12_4_ = fVar58 * fVar84;
  auVar17._16_4_ = fVar85 * 0.0;
  auVar17._20_4_ = fVar58 * 0.0;
  auVar17._24_4_ = fVar85 * 0.0;
  auVar17._28_4_ = uVar52;
  auVar146 = vfmadd231ps_fma(auVar17,auVar80,auVar266);
  auVar18._4_4_ = fVar221 * fVar86;
  auVar18._0_4_ = fVar221 * fVar59;
  auVar18._8_4_ = fVar221 * fVar119;
  auVar18._12_4_ = fVar221 * fVar84;
  auVar18._16_4_ = fVar221 * 0.0;
  auVar18._20_4_ = fVar221 * 0.0;
  auVar18._24_4_ = fVar221 * 0.0;
  auVar18._28_4_ = auVar15._4_4_;
  auVar123 = vfmadd231ps_fma(auVar18,auVar80,auVar252);
  fVar85 = auVar65._0_4_;
  fVar58 = auVar65._4_4_;
  auVar10._4_4_ = fVar58 * fVar86;
  auVar10._0_4_ = fVar85 * fVar59;
  auVar10._8_4_ = fVar85 * fVar119;
  auVar10._12_4_ = fVar58 * fVar84;
  auVar10._16_4_ = fVar85 * 0.0;
  auVar10._20_4_ = fVar58 * 0.0;
  auVar10._24_4_ = fVar85 * 0.0;
  auVar10._28_4_ = fVar268;
  auVar147 = vfmadd231ps_fma(auVar10,auVar80,auVar107);
  auVar15 = vshufps_avx(auVar247,auVar247,0xaa);
  local_568._8_8_ = auVar15._0_8_;
  local_568._0_8_ = local_568._8_8_;
  local_568._16_8_ = local_568._8_8_;
  local_568._24_8_ = local_568._8_8_;
  auVar126 = vshufps_avx(auVar247,auVar247,0xff);
  uStack_660 = auVar126._0_8_;
  local_668 = (undefined1  [8])uStack_660;
  uStack_658 = uStack_660;
  uStack_650 = uStack_660;
  auVar19._4_4_ = fVar57 * fVar86;
  auVar19._0_4_ = fVar57 * fVar59;
  auVar19._8_4_ = fVar57 * fVar119;
  auVar19._12_4_ = fVar57 * fVar84;
  auVar19._16_4_ = fVar57 * 0.0;
  auVar19._20_4_ = fVar57 * 0.0;
  auVar19._24_4_ = fVar57 * 0.0;
  auVar19._28_4_ = fVar57;
  auVar247 = vfmadd231ps_fma(auVar19,auVar80,auVar187);
  auVar126 = vshufps_avx(auVar93,auVar93,0xaa);
  auVar188._0_8_ = auVar126._0_8_;
  auVar188._8_8_ = auVar188._0_8_;
  auVar188._16_8_ = auVar188._0_8_;
  auVar188._24_8_ = auVar188._0_8_;
  auVar65 = vshufps_avx(auVar93,auVar93,0xff);
  local_4e8._8_8_ = auVar65._0_8_;
  local_4e8._0_8_ = local_4e8._8_8_;
  local_4e8._16_8_ = local_4e8._8_8_;
  local_4e8._24_8_ = local_4e8._8_8_;
  fVar85 = auVar92._0_4_;
  fVar58 = auVar92._4_4_;
  auVar20._4_4_ = fVar58 * fVar86;
  auVar20._0_4_ = fVar85 * fVar59;
  auVar20._8_4_ = fVar85 * fVar119;
  auVar20._12_4_ = fVar58 * fVar84;
  auVar20._16_4_ = fVar85 * 0.0;
  auVar20._20_4_ = fVar58 * 0.0;
  auVar20._24_4_ = fVar85 * 0.0;
  auVar20._28_4_ = auVar15._4_4_;
  auVar159 = vfmadd231ps_fma(auVar20,auVar80,auVar202);
  auVar21._28_4_ = fVar58;
  auVar21._0_28_ =
       ZEXT1628(CONCAT412(auVar123._12_4_ * fVar84,
                          CONCAT48(auVar123._8_4_ * fVar119,
                                   CONCAT44(auVar123._4_4_ * fVar86,auVar123._0_4_ * fVar59))));
  auVar134 = vfmadd231ps_fma(auVar21,auVar80,ZEXT1632(auVar134));
  fVar85 = auVar65._4_4_;
  auVar254._28_4_ = fVar85;
  auVar254._0_28_ =
       ZEXT1628(CONCAT412(auVar147._12_4_ * fVar84,
                          CONCAT48(auVar147._8_4_ * fVar119,
                                   CONCAT44(auVar147._4_4_ * fVar86,auVar147._0_4_ * fVar59))));
  auVar146 = vfmadd231ps_fma(auVar254,auVar80,ZEXT1632(auVar146));
  auVar15 = vshufps_avx(auVar94,auVar94,0xaa);
  uVar88 = auVar15._0_8_;
  auVar174._8_8_ = uVar88;
  auVar174._0_8_ = uVar88;
  auVar174._16_8_ = uVar88;
  auVar174._24_8_ = uVar88;
  auVar92 = vshufps_avx(auVar94,auVar94,0xff);
  uVar88 = auVar92._0_8_;
  auVar283._8_8_ = uVar88;
  auVar283._0_8_ = uVar88;
  auVar283._16_8_ = uVar88;
  auVar283._24_8_ = uVar88;
  auVar94 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar247._12_4_ * fVar84,
                                               CONCAT48(auVar247._8_4_ * fVar119,
                                                        CONCAT44(auVar247._4_4_ * fVar86,
                                                                 auVar247._0_4_ * fVar59)))),auVar80
                            ,ZEXT1632(auVar123));
  auVar247 = vshufps_avx(auVar240,auVar240,0xaa);
  auVar93 = vshufps_avx(auVar240,auVar240,0xff);
  auVar240 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar84 * auVar159._12_4_,
                                                CONCAT48(fVar119 * auVar159._8_4_,
                                                         CONCAT44(fVar86 * auVar159._4_4_,
                                                                  fVar59 * auVar159._0_4_)))),
                             auVar80,ZEXT1632(auVar147));
  auVar123 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar84 * auVar94._12_4_,
                                                CONCAT48(fVar119 * auVar94._8_4_,
                                                         CONCAT44(fVar86 * auVar94._4_4_,
                                                                  fVar59 * auVar94._0_4_)))),auVar80
                             ,ZEXT1632(auVar134));
  auVar16 = vsubps_avx(ZEXT1632(auVar94),ZEXT1632(auVar134));
  auVar94 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar84 * auVar240._12_4_,
                                               CONCAT48(fVar119 * auVar240._8_4_,
                                                        CONCAT44(fVar86 * auVar240._4_4_,
                                                                 fVar59 * auVar240._0_4_)))),auVar80
                            ,ZEXT1632(auVar146));
  auVar17 = vsubps_avx(ZEXT1632(auVar240),ZEXT1632(auVar146));
  fStack_3cc = auVar17._28_4_;
  auVar253._0_4_ = fStack_140 * auVar16._0_4_ * 3.0;
  auVar253._4_4_ = fStack_140 * auVar16._4_4_ * 3.0;
  auVar253._8_4_ = fStack_140 * auVar16._8_4_ * 3.0;
  auVar253._12_4_ = fStack_140 * auVar16._12_4_ * 3.0;
  auVar253._16_4_ = fStack_140 * auVar16._16_4_ * 3.0;
  auVar253._20_4_ = fStack_140 * auVar16._20_4_ * 3.0;
  auVar253._24_4_ = fStack_140 * auVar16._24_4_ * 3.0;
  auVar253._28_4_ = 0;
  local_3e8._0_4_ = fStack_140 * auVar17._0_4_ * 3.0;
  local_3e8._4_4_ = fStack_140 * auVar17._4_4_ * 3.0;
  fStack_3e0 = fStack_140 * auVar17._8_4_ * 3.0;
  fStack_3dc = fStack_140 * auVar17._12_4_ * 3.0;
  fStack_3d8 = fStack_140 * auVar17._16_4_ * 3.0;
  fStack_3d4 = fStack_140 * auVar17._20_4_ * 3.0;
  fStack_3d0 = fStack_140 * auVar17._24_4_ * 3.0;
  fVar58 = auVar126._0_4_;
  fVar57 = auVar126._4_4_;
  auVar23._4_4_ = fVar57 * fVar86;
  auVar23._0_4_ = fVar58 * fVar59;
  auVar23._8_4_ = fVar58 * fVar119;
  auVar23._12_4_ = fVar57 * fVar84;
  auVar23._16_4_ = fVar58 * 0.0;
  auVar23._20_4_ = fVar57 * 0.0;
  auVar23._24_4_ = fVar58 * 0.0;
  auVar23._28_4_ = fStack_3cc;
  auVar126 = vfmadd231ps_fma(auVar23,auVar80,local_568);
  fVar58 = auVar65._0_4_;
  auVar24._4_4_ = fVar85 * fVar86;
  auVar24._0_4_ = fVar58 * fVar59;
  auVar24._8_4_ = fVar58 * fVar119;
  auVar24._12_4_ = fVar85 * fVar84;
  auVar24._16_4_ = fVar58 * 0.0;
  auVar24._20_4_ = fVar85 * 0.0;
  auVar24._24_4_ = fVar58 * 0.0;
  auVar24._28_4_ = 0;
  auVar65 = vfmadd231ps_fma(auVar24,auVar80,_local_668);
  fVar85 = auVar15._0_4_;
  fVar58 = auVar15._4_4_;
  auVar25._4_4_ = fVar58 * fVar86;
  auVar25._0_4_ = fVar85 * fVar59;
  auVar25._8_4_ = fVar85 * fVar119;
  auVar25._12_4_ = fVar58 * fVar84;
  auVar25._16_4_ = fVar85 * 0.0;
  auVar25._20_4_ = fVar58 * 0.0;
  auVar25._24_4_ = fVar85 * 0.0;
  auVar25._28_4_ = auVar16._28_4_;
  auVar15 = vfmadd231ps_fma(auVar25,auVar80,auVar188);
  fVar85 = auVar92._0_4_;
  fVar221 = auVar92._4_4_;
  auVar26._4_4_ = fVar221 * fVar86;
  auVar26._0_4_ = fVar85 * fVar59;
  auVar26._8_4_ = fVar85 * fVar119;
  auVar26._12_4_ = fVar221 * fVar84;
  auVar26._16_4_ = fVar85 * 0.0;
  auVar26._20_4_ = fVar221 * 0.0;
  auVar26._24_4_ = fVar85 * 0.0;
  auVar26._28_4_ = fVar57;
  auVar92 = vfmadd231ps_fma(auVar26,auVar80,local_4e8);
  local_4e8 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar123));
  fVar85 = auVar247._0_4_;
  fVar58 = auVar247._4_4_;
  auVar27._4_4_ = fVar58 * fVar86;
  auVar27._0_4_ = fVar85 * fVar59;
  auVar27._8_4_ = fVar85 * fVar119;
  auVar27._12_4_ = fVar58 * fVar84;
  auVar27._16_4_ = fVar85 * 0.0;
  auVar27._20_4_ = fVar58 * 0.0;
  auVar27._24_4_ = fVar85 * 0.0;
  auVar27._28_4_ = fVar58;
  auVar247 = vfmadd231ps_fma(auVar27,auVar80,auVar174);
  auVar19 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar94));
  fVar85 = auVar93._0_4_;
  fVar58 = auVar93._4_4_;
  auVar28._4_4_ = fVar58 * fVar86;
  auVar28._0_4_ = fVar85 * fVar59;
  auVar28._8_4_ = fVar85 * fVar119;
  auVar28._12_4_ = fVar58 * fVar84;
  auVar28._16_4_ = fVar85 * 0.0;
  auVar28._20_4_ = fVar58 * 0.0;
  auVar28._24_4_ = fVar85 * 0.0;
  auVar28._28_4_ = fVar58;
  auVar93 = vfmadd231ps_fma(auVar28,auVar80,auVar283);
  auVar29._28_4_ = fVar221;
  auVar29._0_28_ =
       ZEXT1628(CONCAT412(auVar15._12_4_ * fVar84,
                          CONCAT48(auVar15._8_4_ * fVar119,
                                   CONCAT44(auVar15._4_4_ * fVar86,auVar15._0_4_ * fVar59))));
  auVar126 = vfmadd231ps_fma(auVar29,auVar80,ZEXT1632(auVar126));
  auVar65 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar84 * auVar92._12_4_,
                                               CONCAT48(fVar119 * auVar92._8_4_,
                                                        CONCAT44(fVar86 * auVar92._4_4_,
                                                                 fVar59 * auVar92._0_4_)))),auVar80,
                            ZEXT1632(auVar65));
  auVar108._0_4_ = auVar123._0_4_ + auVar253._0_4_;
  auVar108._4_4_ = auVar123._4_4_ + auVar253._4_4_;
  auVar108._8_4_ = auVar123._8_4_ + auVar253._8_4_;
  auVar108._12_4_ = auVar123._12_4_ + auVar253._12_4_;
  auVar108._16_4_ = auVar253._16_4_ + 0.0;
  auVar108._20_4_ = auVar253._20_4_ + 0.0;
  auVar108._24_4_ = auVar253._24_4_ + 0.0;
  auVar108._28_4_ = 0;
  auVar15 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar247._12_4_ * fVar84,
                                               CONCAT48(auVar247._8_4_ * fVar119,
                                                        CONCAT44(auVar247._4_4_ * fVar86,
                                                                 auVar247._0_4_ * fVar59)))),auVar80
                            ,ZEXT1632(auVar15));
  auVar92 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar93._12_4_ * fVar84,
                                               CONCAT48(auVar93._8_4_ * fVar119,
                                                        CONCAT44(auVar93._4_4_ * fVar86,
                                                                 auVar93._0_4_ * fVar59)))),auVar80,
                            ZEXT1632(auVar92));
  auVar247 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar84 * auVar15._12_4_,
                                                CONCAT48(fVar119 * auVar15._8_4_,
                                                         CONCAT44(fVar86 * auVar15._4_4_,
                                                                  fVar59 * auVar15._0_4_)))),auVar80
                             ,ZEXT1632(auVar126));
  auVar93 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar92._12_4_ * fVar84,
                                               CONCAT48(auVar92._8_4_ * fVar119,
                                                        CONCAT44(auVar92._4_4_ * fVar86,
                                                                 auVar92._0_4_ * fVar59)))),
                            ZEXT1632(auVar65),auVar80);
  auVar80 = vsubps_avx(ZEXT1632(auVar15),ZEXT1632(auVar126));
  auVar16 = vsubps_avx(ZEXT1632(auVar92),ZEXT1632(auVar65));
  auVar277._0_4_ = fStack_140 * auVar80._0_4_ * 3.0;
  auVar277._4_4_ = fStack_140 * auVar80._4_4_ * 3.0;
  auVar277._8_4_ = fStack_140 * auVar80._8_4_ * 3.0;
  auVar277._12_4_ = fStack_140 * auVar80._12_4_ * 3.0;
  auVar277._16_4_ = fStack_140 * auVar80._16_4_ * 3.0;
  auVar277._20_4_ = fStack_140 * auVar80._20_4_ * 3.0;
  auVar277._24_4_ = fStack_140 * auVar80._24_4_ * 3.0;
  auVar277._28_4_ = 0;
  local_158 = fStack_140 * auVar16._0_4_ * 3.0;
  fStack_154 = fStack_140 * auVar16._4_4_ * 3.0;
  auVar30._4_4_ = fStack_154;
  auVar30._0_4_ = local_158;
  fStack_150 = fStack_140 * auVar16._8_4_ * 3.0;
  auVar30._8_4_ = fStack_150;
  fStack_14c = fStack_140 * auVar16._12_4_ * 3.0;
  auVar30._12_4_ = fStack_14c;
  fStack_148 = fStack_140 * auVar16._16_4_ * 3.0;
  auVar30._16_4_ = fStack_148;
  fStack_144 = fStack_140 * auVar16._20_4_ * 3.0;
  auVar30._20_4_ = fStack_144;
  fStack_140 = fStack_140 * auVar16._24_4_ * 3.0;
  auVar30._24_4_ = fStack_140;
  auVar30._28_4_ = 0x40400000;
  _local_508 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar247));
  auVar20 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar93));
  auVar80 = vsubps_avx(ZEXT1632(auVar247),ZEXT1632(auVar123));
  auVar16 = vsubps_avx(ZEXT1632(auVar93),ZEXT1632(auVar94));
  auVar17 = vsubps_avx(_local_508,local_4e8);
  fVar268 = auVar80._0_4_ + auVar17._0_4_;
  fVar269 = auVar80._4_4_ + auVar17._4_4_;
  fVar190 = auVar80._8_4_ + auVar17._8_4_;
  fVar191 = auVar80._12_4_ + auVar17._12_4_;
  fVar192 = auVar80._16_4_ + auVar17._16_4_;
  fVar193 = auVar80._20_4_ + auVar17._20_4_;
  fVar194 = auVar80._24_4_ + auVar17._24_4_;
  auVar18 = vsubps_avx(auVar20,auVar19);
  auVar81._0_4_ = auVar16._0_4_ + auVar18._0_4_;
  auVar81._4_4_ = auVar16._4_4_ + auVar18._4_4_;
  auVar81._8_4_ = auVar16._8_4_ + auVar18._8_4_;
  auVar81._12_4_ = auVar16._12_4_ + auVar18._12_4_;
  auVar81._16_4_ = auVar16._16_4_ + auVar18._16_4_;
  auVar81._20_4_ = auVar16._20_4_ + auVar18._20_4_;
  auVar81._24_4_ = auVar16._24_4_ + auVar18._24_4_;
  auVar81._28_4_ = auVar16._28_4_ + auVar18._28_4_;
  local_f8 = ZEXT1632(auVar94);
  fVar59 = auVar94._0_4_;
  local_178 = (float)local_3e8._0_4_ + fVar59;
  fVar86 = auVar94._4_4_;
  fStack_174 = (float)local_3e8._4_4_ + fVar86;
  fVar119 = auVar94._8_4_;
  fStack_170 = fStack_3e0 + fVar119;
  fVar84 = auVar94._12_4_;
  fStack_16c = fStack_3dc + fVar84;
  fStack_168 = fStack_3d8 + 0.0;
  fStack_164 = fStack_3d4 + 0.0;
  fStack_160 = fStack_3d0 + 0.0;
  local_b8 = ZEXT1632(auVar123);
  auVar16 = vsubps_avx(local_b8,auVar253);
  local_d8 = vpermps_avx2(_DAT_01fb7720,auVar16);
  auVar16 = vsubps_avx(local_f8,_local_3e8);
  local_198 = vpermps_avx2(_DAT_01fb7720,auVar16);
  local_118._0_4_ = auVar247._0_4_ + auVar277._0_4_;
  local_118._4_4_ = auVar247._4_4_ + auVar277._4_4_;
  local_118._8_4_ = auVar247._8_4_ + auVar277._8_4_;
  local_118._12_4_ = auVar247._12_4_ + auVar277._12_4_;
  local_118._16_4_ = auVar277._16_4_ + 0.0;
  local_118._20_4_ = auVar277._20_4_ + 0.0;
  local_118._24_4_ = auVar277._24_4_ + 0.0;
  local_118._28_4_ = 0;
  auVar254 = ZEXT1632(auVar247);
  auVar16 = vsubps_avx(auVar254,auVar277);
  auVar21 = vpermps_avx2(_DAT_01fb7720,auVar16);
  fVar85 = auVar93._0_4_;
  local_158 = fVar85 + local_158;
  fVar58 = auVar93._4_4_;
  fStack_154 = fVar58 + fStack_154;
  fVar57 = auVar93._8_4_;
  fStack_150 = fVar57 + fStack_150;
  fVar221 = auVar93._12_4_;
  fStack_14c = fVar221 + fStack_14c;
  fStack_148 = fStack_148 + 0.0;
  fStack_144 = fStack_144 + 0.0;
  fStack_140 = fStack_140 + 0.0;
  auVar16 = vsubps_avx(ZEXT1632(auVar93),auVar30);
  local_138 = vpermps_avx2(_DAT_01fb7720,auVar16);
  auVar31._4_4_ = fVar86 * fVar269;
  auVar31._0_4_ = fVar59 * fVar268;
  auVar31._8_4_ = fVar119 * fVar190;
  auVar31._12_4_ = fVar84 * fVar191;
  auVar31._16_4_ = fVar192 * 0.0;
  auVar31._20_4_ = fVar193 * 0.0;
  auVar31._24_4_ = fVar194 * 0.0;
  auVar31._28_4_ = auVar16._28_4_;
  auVar15 = vfnmadd231ps_fma(auVar31,local_b8,auVar81);
  fStack_15c = fStack_3cc + 0.0;
  auVar32._4_4_ = fStack_174 * fVar269;
  auVar32._0_4_ = local_178 * fVar268;
  auVar32._8_4_ = fStack_170 * fVar190;
  auVar32._12_4_ = fStack_16c * fVar191;
  auVar32._16_4_ = fStack_168 * fVar192;
  auVar32._20_4_ = fStack_164 * fVar193;
  auVar32._24_4_ = fStack_160 * fVar194;
  auVar32._28_4_ = 0;
  auVar126 = vfnmadd231ps_fma(auVar32,auVar81,auVar108);
  auVar33._4_4_ = local_198._4_4_ * fVar269;
  auVar33._0_4_ = local_198._0_4_ * fVar268;
  auVar33._8_4_ = local_198._8_4_ * fVar190;
  auVar33._12_4_ = local_198._12_4_ * fVar191;
  auVar33._16_4_ = local_198._16_4_ * fVar192;
  auVar33._20_4_ = local_198._20_4_ * fVar193;
  auVar33._24_4_ = local_198._24_4_ * fVar194;
  auVar33._28_4_ = fStack_3cc + 0.0;
  auVar65 = vfnmadd231ps_fma(auVar33,local_d8,auVar81);
  local_668._0_4_ = auVar19._0_4_;
  local_668._4_4_ = auVar19._4_4_;
  uStack_660._0_4_ = auVar19._8_4_;
  uStack_660._4_4_ = auVar19._12_4_;
  uStack_658._0_4_ = auVar19._16_4_;
  uStack_658._4_4_ = auVar19._20_4_;
  uStack_650._0_4_ = auVar19._24_4_;
  uStack_650._4_4_ = auVar19._28_4_;
  auVar34._4_4_ = (float)local_668._4_4_ * fVar269;
  auVar34._0_4_ = (float)local_668._0_4_ * fVar268;
  auVar34._8_4_ = (float)uStack_660 * fVar190;
  auVar34._12_4_ = uStack_660._4_4_ * fVar191;
  auVar34._16_4_ = (float)uStack_658 * fVar192;
  auVar34._20_4_ = uStack_658._4_4_ * fVar193;
  auVar34._24_4_ = (float)uStack_650 * fVar194;
  auVar34._28_4_ = uStack_650._4_4_;
  auVar92 = vfnmadd231ps_fma(auVar34,local_4e8,auVar81);
  auVar203._0_4_ = fVar85 * fVar268;
  auVar203._4_4_ = fVar58 * fVar269;
  auVar203._8_4_ = fVar57 * fVar190;
  auVar203._12_4_ = fVar221 * fVar191;
  auVar203._16_4_ = fVar192 * 0.0;
  auVar203._20_4_ = fVar193 * 0.0;
  auVar203._24_4_ = fVar194 * 0.0;
  auVar203._28_4_ = 0;
  auVar247 = vfnmadd231ps_fma(auVar203,auVar254,auVar81);
  uStack_13c = 0x40400000;
  auVar35._4_4_ = fStack_154 * fVar269;
  auVar35._0_4_ = local_158 * fVar268;
  auVar35._8_4_ = fStack_150 * fVar190;
  auVar35._12_4_ = fStack_14c * fVar191;
  auVar35._16_4_ = fStack_148 * fVar192;
  auVar35._20_4_ = fStack_144 * fVar193;
  auVar35._24_4_ = fStack_140 * fVar194;
  auVar35._28_4_ = local_4e8._28_4_;
  auVar94 = vfnmadd231ps_fma(auVar35,local_118,auVar81);
  auVar36._4_4_ = local_138._4_4_ * fVar269;
  auVar36._0_4_ = local_138._0_4_ * fVar268;
  auVar36._8_4_ = local_138._8_4_ * fVar190;
  auVar36._12_4_ = local_138._12_4_ * fVar191;
  auVar36._16_4_ = local_138._16_4_ * fVar192;
  auVar36._20_4_ = local_138._20_4_ * fVar193;
  auVar36._24_4_ = local_138._24_4_ * fVar194;
  auVar36._28_4_ = local_138._28_4_;
  auVar240 = vfnmadd231ps_fma(auVar36,auVar21,auVar81);
  auVar37._4_4_ = auVar20._4_4_ * fVar269;
  auVar37._0_4_ = auVar20._0_4_ * fVar268;
  auVar37._8_4_ = auVar20._8_4_ * fVar190;
  auVar37._12_4_ = auVar20._12_4_ * fVar191;
  auVar37._16_4_ = auVar20._16_4_ * fVar192;
  auVar37._20_4_ = auVar20._20_4_ * fVar193;
  auVar37._24_4_ = auVar20._24_4_ * fVar194;
  auVar37._28_4_ = auVar80._28_4_ + auVar17._28_4_;
  auVar219 = ZEXT3264(_local_508);
  auVar134 = vfnmadd231ps_fma(auVar37,_local_508,auVar81);
  auVar16 = vminps_avx(ZEXT1632(auVar15),ZEXT1632(auVar126));
  auVar80 = vmaxps_avx(ZEXT1632(auVar15),ZEXT1632(auVar126));
  auVar17 = vminps_avx(ZEXT1632(auVar65),ZEXT1632(auVar92));
  auVar17 = vminps_avx(auVar16,auVar17);
  auVar16 = vmaxps_avx(ZEXT1632(auVar65),ZEXT1632(auVar92));
  auVar80 = vmaxps_avx(auVar80,auVar16);
  auVar18 = vminps_avx(ZEXT1632(auVar247),ZEXT1632(auVar94));
  auVar16 = vmaxps_avx(ZEXT1632(auVar247),ZEXT1632(auVar94));
  auVar10 = vminps_avx(ZEXT1632(auVar240),ZEXT1632(auVar134));
  auVar18 = vminps_avx(auVar18,auVar10);
  auVar18 = vminps_avx(auVar17,auVar18);
  auVar17 = vmaxps_avx(ZEXT1632(auVar240),ZEXT1632(auVar134));
  auVar16 = vmaxps_avx(auVar16,auVar17);
  auVar16 = vmaxps_avx(auVar80,auVar16);
  auVar46._4_4_ = fStack_74;
  auVar46._0_4_ = local_78;
  auVar46._8_4_ = fStack_70;
  auVar46._12_4_ = fStack_6c;
  auVar46._16_4_ = fStack_68;
  auVar46._20_4_ = fStack_64;
  auVar46._24_4_ = fStack_60;
  auVar46._28_4_ = fStack_5c;
  auVar80 = vcmpps_avx(auVar18,auVar46,2);
  auVar45._4_4_ = fStack_94;
  auVar45._0_4_ = local_98;
  auVar45._8_4_ = fStack_90;
  auVar45._12_4_ = fStack_8c;
  auVar45._16_4_ = fStack_88;
  auVar45._20_4_ = fStack_84;
  auVar45._24_4_ = fStack_80;
  auVar45._28_4_ = fStack_7c;
  auVar16 = vcmpps_avx(auVar16,auVar45,5);
  auVar80 = vandps_avx(auVar16,auVar80);
  auVar16 = local_1b8 & auVar80;
  if ((((((((auVar16 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar16 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar16 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar16 >> 0x7f,0) != '\0') ||
        (auVar16 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar16 >> 0xbf,0) != '\0') ||
      (auVar16 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar16[0x1f] < '\0') {
    auVar16 = vsubps_avx(local_4e8,local_b8);
    auVar17 = vsubps_avx(_local_508,auVar254);
    fVar269 = auVar16._0_4_ + auVar17._0_4_;
    fVar190 = auVar16._4_4_ + auVar17._4_4_;
    fVar191 = auVar16._8_4_ + auVar17._8_4_;
    fVar192 = auVar16._12_4_ + auVar17._12_4_;
    fVar193 = auVar16._16_4_ + auVar17._16_4_;
    fVar194 = auVar16._20_4_ + auVar17._20_4_;
    fVar87 = auVar16._24_4_ + auVar17._24_4_;
    auVar18 = vsubps_avx(auVar19,local_f8);
    auVar10 = vsubps_avx(auVar20,ZEXT1632(auVar93));
    auVar109._0_4_ = auVar18._0_4_ + auVar10._0_4_;
    auVar109._4_4_ = auVar18._4_4_ + auVar10._4_4_;
    auVar109._8_4_ = auVar18._8_4_ + auVar10._8_4_;
    auVar109._12_4_ = auVar18._12_4_ + auVar10._12_4_;
    auVar109._16_4_ = auVar18._16_4_ + auVar10._16_4_;
    auVar109._20_4_ = auVar18._20_4_ + auVar10._20_4_;
    auVar109._24_4_ = auVar18._24_4_ + auVar10._24_4_;
    fVar268 = auVar10._28_4_;
    auVar109._28_4_ = auVar18._28_4_ + fVar268;
    auVar38._4_4_ = fVar86 * fVar190;
    auVar38._0_4_ = fVar59 * fVar269;
    auVar38._8_4_ = fVar119 * fVar191;
    auVar38._12_4_ = fVar84 * fVar192;
    auVar38._16_4_ = fVar193 * 0.0;
    auVar38._20_4_ = fVar194 * 0.0;
    auVar38._24_4_ = fVar87 * 0.0;
    auVar38._28_4_ = auVar20._28_4_;
    auVar247 = vfnmadd231ps_fma(auVar38,auVar109,local_b8);
    auVar39._4_4_ = fVar190 * fStack_174;
    auVar39._0_4_ = fVar269 * local_178;
    auVar39._8_4_ = fVar191 * fStack_170;
    auVar39._12_4_ = fVar192 * fStack_16c;
    auVar39._16_4_ = fVar193 * fStack_168;
    auVar39._20_4_ = fVar194 * fStack_164;
    auVar39._24_4_ = fVar87 * fStack_160;
    auVar39._28_4_ = 0;
    auVar15 = vfnmadd213ps_fma(auVar108,auVar109,auVar39);
    auVar40._4_4_ = fVar190 * local_198._4_4_;
    auVar40._0_4_ = fVar269 * local_198._0_4_;
    auVar40._8_4_ = fVar191 * local_198._8_4_;
    auVar40._12_4_ = fVar192 * local_198._12_4_;
    auVar40._16_4_ = fVar193 * local_198._16_4_;
    auVar40._20_4_ = fVar194 * local_198._20_4_;
    auVar40._24_4_ = fVar87 * local_198._24_4_;
    auVar40._28_4_ = 0;
    auVar126 = vfnmadd213ps_fma(local_d8,auVar109,auVar40);
    auVar41._4_4_ = (float)local_668._4_4_ * fVar190;
    auVar41._0_4_ = (float)local_668._0_4_ * fVar269;
    auVar41._8_4_ = (float)uStack_660 * fVar191;
    auVar41._12_4_ = uStack_660._4_4_ * fVar192;
    auVar41._16_4_ = (float)uStack_658 * fVar193;
    auVar41._20_4_ = uStack_658._4_4_ * fVar194;
    auVar41._24_4_ = (float)uStack_650 * fVar87;
    auVar41._28_4_ = 0;
    auVar93 = vfnmadd231ps_fma(auVar41,auVar109,local_4e8);
    auVar129._0_4_ = fVar85 * fVar269;
    auVar129._4_4_ = fVar58 * fVar190;
    auVar129._8_4_ = fVar57 * fVar191;
    auVar129._12_4_ = fVar221 * fVar192;
    auVar129._16_4_ = fVar193 * 0.0;
    auVar129._20_4_ = fVar194 * 0.0;
    auVar129._24_4_ = fVar87 * 0.0;
    auVar129._28_4_ = 0;
    auVar94 = vfnmadd231ps_fma(auVar129,auVar109,auVar254);
    auVar42._4_4_ = fVar190 * fStack_154;
    auVar42._0_4_ = fVar269 * local_158;
    auVar42._8_4_ = fVar191 * fStack_150;
    auVar42._12_4_ = fVar192 * fStack_14c;
    auVar42._16_4_ = fVar193 * fStack_148;
    auVar42._20_4_ = fVar194 * fStack_144;
    auVar42._24_4_ = fVar87 * fStack_140;
    auVar42._28_4_ = fVar268;
    auVar65 = vfnmadd213ps_fma(local_118,auVar109,auVar42);
    auVar43._4_4_ = fVar190 * local_138._4_4_;
    auVar43._0_4_ = fVar269 * local_138._0_4_;
    auVar43._8_4_ = fVar191 * local_138._8_4_;
    auVar43._12_4_ = fVar192 * local_138._12_4_;
    auVar43._16_4_ = fVar193 * local_138._16_4_;
    auVar43._20_4_ = fVar194 * local_138._20_4_;
    auVar43._24_4_ = fVar87 * local_138._24_4_;
    auVar43._28_4_ = fVar268;
    auVar92 = vfnmadd213ps_fma(auVar21,auVar109,auVar43);
    auVar219 = ZEXT1664(auVar92);
    auVar44._4_4_ = fVar190 * auVar20._4_4_;
    auVar44._0_4_ = fVar269 * auVar20._0_4_;
    auVar44._8_4_ = fVar191 * auVar20._8_4_;
    auVar44._12_4_ = fVar192 * auVar20._12_4_;
    auVar44._16_4_ = fVar193 * auVar20._16_4_;
    auVar44._20_4_ = fVar194 * auVar20._20_4_;
    auVar44._24_4_ = fVar87 * auVar20._24_4_;
    auVar44._28_4_ = auVar16._28_4_ + auVar17._28_4_;
    auVar240 = vfnmadd231ps_fma(auVar44,auVar109,_local_508);
    auVar17 = vminps_avx(ZEXT1632(auVar247),ZEXT1632(auVar15));
    auVar16 = vmaxps_avx(ZEXT1632(auVar247),ZEXT1632(auVar15));
    auVar18 = vminps_avx(ZEXT1632(auVar126),ZEXT1632(auVar93));
    auVar18 = vminps_avx(auVar17,auVar18);
    auVar17 = vmaxps_avx(ZEXT1632(auVar126),ZEXT1632(auVar93));
    auVar16 = vmaxps_avx(auVar16,auVar17);
    auVar10 = vminps_avx(ZEXT1632(auVar94),ZEXT1632(auVar65));
    auVar17 = vmaxps_avx(ZEXT1632(auVar94),ZEXT1632(auVar65));
    auVar19 = vminps_avx(ZEXT1632(auVar92),ZEXT1632(auVar240));
    auVar10 = vminps_avx(auVar10,auVar19);
    auVar10 = vminps_avx(auVar18,auVar10);
    auVar18 = vmaxps_avx(ZEXT1632(auVar92),ZEXT1632(auVar240));
    auVar17 = vmaxps_avx(auVar17,auVar18);
    auVar17 = vmaxps_avx(auVar16,auVar17);
    auVar16 = vcmpps_avx(auVar10,auVar46,2);
    auVar17 = vcmpps_avx(auVar17,auVar45,5);
    auVar16 = vandps_avx(auVar17,auVar16);
    auVar80 = vandps_avx(auVar80,local_1b8);
    auVar17 = auVar80 & auVar16;
    if ((((((((auVar17 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar17 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar17 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar17 >> 0x7f,0) != '\0') ||
          (auVar17 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar17 >> 0xbf,0) != '\0') ||
        (auVar17 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar17[0x1f] < '\0')
    {
      auVar80 = vandps_avx(auVar16,auVar80);
      uVar51 = vmovmskps_avx(auVar80);
      if (uVar51 != 0) {
        mask_stack[uVar55] = uVar51 & 0xff;
        BVar1 = (BBox1f)vmovlps_avx(auVar105);
        cu_stack[uVar55] = BVar1;
        BVar1 = (BBox1f)vmovlps_avx(auVar66);
        cv_stack[uVar55] = BVar1;
        uVar55 = (ulong)((int)uVar55 + 1);
      }
    }
  }
LAB_01108c41:
  if ((int)uVar55 == 0) {
    uVar52 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar79._4_4_ = uVar52;
    auVar79._0_4_ = uVar52;
    auVar79._8_4_ = uVar52;
    auVar79._12_4_ = uVar52;
    auVar105 = vcmpps_avx(auVar196,auVar79,2);
    uVar48 = vmovmskps_avx(auVar105);
    uVar53 = (ulong)((uint)uVar53 & uVar48);
    goto LAB_01107ee9;
  }
  uVar47 = (int)uVar55 - 1;
  uVar51 = mask_stack[uVar47];
  fVar59 = cu_stack[uVar47].lower;
  fVar86 = cu_stack[uVar47].upper;
  iVar22 = 0;
  for (uVar54 = (ulong)uVar51; (uVar54 & 1) == 0; uVar54 = uVar54 >> 1 | 0x8000000000000000) {
    iVar22 = iVar22 + 1;
  }
  uVar51 = uVar51 - 1 & uVar51;
  if (uVar51 == 0) {
    uVar55 = (ulong)uVar47;
  }
  auVar66._8_8_ = 0;
  auVar66._0_4_ = cv_stack[uVar47].lower;
  auVar66._4_4_ = cv_stack[uVar47].upper;
  mask_stack[uVar47] = uVar51;
  fVar119 = (float)(iVar22 + 1) * 0.14285715;
  auVar105 = vfmadd231ss_fma(ZEXT416((uint)(fVar86 * (float)iVar22 * 0.14285715)),
                             ZEXT416((uint)fVar59),ZEXT416((uint)(1.0 - (float)iVar22 * 0.14285715))
                            );
  auVar15 = vfmadd231ss_fma(ZEXT416((uint)(fVar86 * fVar119)),ZEXT416((uint)fVar59),
                            ZEXT416((uint)(1.0 - fVar119)));
  fVar86 = auVar15._0_4_;
  auVar189._0_4_ = auVar105._0_4_;
  fVar59 = fVar86 - auVar189._0_4_;
  if (fVar59 < 0.16666667) {
    auVar126 = vshufps_avx(auVar66,auVar66,0x50);
    auVar95._8_4_ = 0x3f800000;
    auVar95._0_8_ = 0x3f8000003f800000;
    auVar95._12_4_ = 0x3f800000;
    auVar65 = vsubps_avx(auVar95,auVar126);
    fVar119 = auVar126._0_4_;
    auVar136._0_4_ = fVar119 * fVar131;
    fVar84 = auVar126._4_4_;
    auVar136._4_4_ = fVar84 * fVar142;
    fVar85 = auVar126._8_4_;
    auVar136._8_4_ = fVar85 * fVar131;
    fVar58 = auVar126._12_4_;
    auVar136._12_4_ = fVar58 * fVar142;
    auVar148._0_4_ = fVar119 * fVar255;
    auVar148._4_4_ = fVar84 * fVar267;
    auVar148._8_4_ = fVar85 * fVar255;
    auVar148._12_4_ = fVar58 * fVar267;
    auVar171._0_4_ = fVar119 * fVar195;
    auVar171._4_4_ = fVar84 * fVar204;
    auVar171._8_4_ = fVar85 * fVar195;
    auVar171._12_4_ = fVar58 * fVar204;
    auVar68._0_4_ = fVar119 * fVar205;
    auVar68._4_4_ = fVar84 * fVar220;
    auVar68._8_4_ = fVar85 * fVar205;
    auVar68._12_4_ = fVar58 * fVar220;
    auVar126 = vfmadd231ps_fma(auVar136,auVar65,auVar182);
    auVar92 = vfmadd231ps_fma(auVar148,auVar65,auVar227);
    auVar247 = vfmadd231ps_fma(auVar171,auVar65,auVar246);
    auVar65 = vfmadd231ps_fma(auVar68,auVar65,auVar258);
    auVar130._16_16_ = auVar126;
    auVar130._0_16_ = auVar126;
    auVar141._16_16_ = auVar92;
    auVar141._0_16_ = auVar92;
    auVar156._16_16_ = auVar247;
    auVar156._0_16_ = auVar247;
    auVar189._4_4_ = auVar189._0_4_;
    auVar189._8_4_ = auVar189._0_4_;
    auVar189._12_4_ = auVar189._0_4_;
    auVar189._20_4_ = fVar86;
    auVar189._16_4_ = fVar86;
    auVar189._24_4_ = fVar86;
    auVar189._28_4_ = fVar86;
    auVar80 = vsubps_avx(auVar141,auVar130);
    auVar92 = vfmadd213ps_fma(auVar80,auVar189,auVar130);
    auVar80 = vsubps_avx(auVar156,auVar141);
    auVar93 = vfmadd213ps_fma(auVar80,auVar189,auVar141);
    auVar126 = vsubps_avx(auVar65,auVar247);
    auVar82._16_16_ = auVar126;
    auVar82._0_16_ = auVar126;
    auVar126 = vfmadd213ps_fma(auVar82,auVar189,auVar156);
    auVar80 = vsubps_avx(ZEXT1632(auVar93),ZEXT1632(auVar92));
    auVar65 = vfmadd213ps_fma(auVar80,auVar189,ZEXT1632(auVar92));
    auVar80 = vsubps_avx(ZEXT1632(auVar126),ZEXT1632(auVar93));
    auVar126 = vfmadd213ps_fma(auVar80,auVar189,ZEXT1632(auVar93));
    auVar80 = vsubps_avx(ZEXT1632(auVar126),ZEXT1632(auVar65));
    auVar134 = vfmadd231ps_fma(ZEXT1632(auVar65),auVar80,auVar189);
    fVar221 = auVar80._4_4_ * 3.0;
    local_4e8._0_4_ = fVar59;
    fVar119 = fVar59 * 0.33333334;
    auVar96._0_8_ =
         CONCAT44(auVar134._4_4_ + fVar119 * fVar221,auVar134._0_4_ + fVar119 * auVar80._0_4_ * 3.0)
    ;
    auVar96._8_4_ = auVar134._8_4_ + fVar119 * auVar80._8_4_ * 3.0;
    auVar96._12_4_ = auVar134._12_4_ + fVar119 * auVar80._12_4_ * 3.0;
    auVar65 = vshufpd_avx(auVar134,auVar134,3);
    auVar92 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
    _local_508 = auVar65;
    auVar126 = vsubps_avx(auVar65,auVar134);
    auVar247 = vsubps_avx(auVar92,(undefined1  [16])0x0);
    auVar69._0_4_ = auVar126._0_4_ + auVar247._0_4_;
    auVar69._4_4_ = auVar126._4_4_ + auVar247._4_4_;
    auVar69._8_4_ = auVar126._8_4_ + auVar247._8_4_;
    auVar69._12_4_ = auVar126._12_4_ + auVar247._12_4_;
    auVar126 = vshufps_avx(auVar134,auVar134,0xb1);
    auVar247 = vshufps_avx(auVar96,auVar96,0xb1);
    auVar273._4_4_ = auVar69._0_4_;
    auVar273._0_4_ = auVar69._0_4_;
    auVar273._8_4_ = auVar69._0_4_;
    auVar273._12_4_ = auVar69._0_4_;
    auVar93 = vshufps_avx(auVar69,auVar69,0x55);
    fVar84 = auVar93._0_4_;
    auVar70._0_4_ = fVar84 * auVar126._0_4_;
    fVar85 = auVar93._4_4_;
    auVar70._4_4_ = fVar85 * auVar126._4_4_;
    fVar58 = auVar93._8_4_;
    auVar70._8_4_ = fVar58 * auVar126._8_4_;
    fVar57 = auVar93._12_4_;
    auVar70._12_4_ = fVar57 * auVar126._12_4_;
    auVar149._0_4_ = fVar84 * auVar247._0_4_;
    auVar149._4_4_ = fVar85 * auVar247._4_4_;
    auVar149._8_4_ = fVar58 * auVar247._8_4_;
    auVar149._12_4_ = fVar57 * auVar247._12_4_;
    auVar94 = vfmadd231ps_fma(auVar70,auVar273,auVar134);
    auVar240 = vfmadd231ps_fma(auVar149,auVar273,auVar96);
    auVar247 = vshufps_avx(auVar94,auVar94,0xe8);
    auVar93 = vshufps_avx(auVar240,auVar240,0xe8);
    auVar126 = vcmpps_avx(auVar247,auVar93,1);
    uVar51 = vextractps_avx(auVar126,0);
    auVar146 = auVar240;
    if ((uVar51 & 1) == 0) {
      auVar146 = auVar94;
    }
    auVar122._0_4_ = fVar119 * auVar80._16_4_ * 3.0;
    auVar122._4_4_ = fVar119 * fVar221;
    auVar122._8_4_ = fVar119 * auVar80._24_4_ * 3.0;
    auVar122._12_4_ = fVar119 * auVar219._28_4_;
    auVar160 = vsubps_avx((undefined1  [16])0x0,auVar122);
    auVar123 = vshufps_avx(auVar160,auVar160,0xb1);
    auVar147 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
    auVar183._0_4_ = fVar84 * auVar123._0_4_;
    auVar183._4_4_ = fVar85 * auVar123._4_4_;
    auVar183._8_4_ = fVar58 * auVar123._8_4_;
    auVar183._12_4_ = fVar57 * auVar123._12_4_;
    auVar199._0_4_ = auVar147._0_4_ * fVar84;
    auVar199._4_4_ = auVar147._4_4_ * fVar85;
    auVar199._8_4_ = auVar147._8_4_ * fVar58;
    auVar199._12_4_ = auVar147._12_4_ * fVar57;
    auVar161 = vfmadd231ps_fma(auVar183,auVar273,auVar160);
    auVar162 = vfmadd231ps_fma(auVar199,(undefined1  [16])0x0,auVar273);
    auVar147 = vshufps_avx(auVar161,auVar161,0xe8);
    auVar159 = vshufps_avx(auVar162,auVar162,0xe8);
    auVar219 = ZEXT1664(auVar159);
    auVar123 = vcmpps_avx(auVar147,auVar159,1);
    uVar51 = vextractps_avx(auVar123,0);
    auVar163 = auVar162;
    if ((uVar51 & 1) == 0) {
      auVar163 = auVar161;
    }
    auVar146 = vmaxss_avx(auVar163,auVar146);
    auVar247 = vminps_avx(auVar247,auVar93);
    auVar93 = vminps_avx(auVar147,auVar159);
    auVar93 = vminps_avx(auVar247,auVar93);
    auVar126 = vshufps_avx(auVar126,auVar126,0x55);
    auVar126 = vblendps_avx(auVar126,auVar123,2);
    auVar123 = vpslld_avx(auVar126,0x1f);
    auVar126 = vshufpd_avx(auVar240,auVar240,1);
    auVar126 = vinsertps_avx(auVar126,auVar162,0x9c);
    auVar247 = vshufpd_avx(auVar94,auVar94,1);
    auVar247 = vinsertps_avx(auVar247,auVar161,0x9c);
    auVar126 = vblendvps_avx(auVar247,auVar126,auVar123);
    auVar247 = vmovshdup_avx(auVar126);
    auVar126 = vmaxss_avx(auVar247,auVar126);
    fVar58 = auVar93._0_4_;
    auVar247 = vmovshdup_avx(auVar93);
    fVar85 = auVar126._0_4_;
    fVar119 = auVar247._0_4_;
    fVar84 = auVar146._0_4_;
    if (((0.0001 <= fVar58) || (fVar85 <= -0.0001)) && (0.0001 <= fVar119 || fVar85 <= -0.0001))
    goto code_r0x01108f4e;
    goto LAB_01108f74;
  }
  auVar105 = vinsertps_avx(auVar105,auVar15,0x10);
  goto LAB_01108695;
code_r0x01108f4e:
  auVar247 = vcmpps_avx(auVar247,SUB6416(ZEXT464(0x38d1b717),0),5);
  auVar94 = vcmpps_avx(auVar93,SUB6416(ZEXT464(0x38d1b717),0),5);
  auVar247 = vandps_avx(auVar94,auVar247);
  if (fVar84 <= -0.0001 || (auVar247 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
  goto LAB_01108c41;
LAB_01108f74:
  auVar94 = vcmpps_avx(auVar93,_DAT_01f45a50,1);
  auVar240 = SUB6416(ZEXT864(0),0) << 0x20;
  auVar247 = vcmpss_avx(auVar146,ZEXT816(0) << 0x20,1);
  auVar97._8_4_ = 0x3f800000;
  auVar97._0_8_ = 0x3f8000003f800000;
  auVar97._12_4_ = 0x3f800000;
  auVar113._8_4_ = 0xbf800000;
  auVar113._0_8_ = 0xbf800000bf800000;
  auVar113._12_4_ = 0xbf800000;
  auVar247 = vblendvps_avx(auVar97,auVar113,auVar247);
  auVar94 = vblendvps_avx(auVar97,auVar113,auVar94);
  fVar221 = auVar94._0_4_;
  fVar57 = auVar247._0_4_;
  auVar247 = SUB6416(ZEXT864(0),0) << 0x20;
  if ((fVar221 == fVar57) && (!NAN(fVar221) && !NAN(fVar57))) {
    auVar247 = SUB6416(ZEXT464(0x7f800000),0);
  }
  if ((fVar221 == fVar57) && (!NAN(fVar221) && !NAN(fVar57))) {
    auVar240 = SUB6416(ZEXT464(0xff800000),0);
  }
  auVar94 = vmovshdup_avx(auVar94);
  fVar268 = auVar94._0_4_;
  if ((fVar221 != fVar268) || (NAN(fVar221) || NAN(fVar268))) {
    if ((fVar119 != fVar58) || (NAN(fVar119) || NAN(fVar58))) {
      auVar124._0_8_ = auVar93._0_8_ ^ 0x8000000080000000;
      auVar124._8_4_ = auVar93._8_4_ ^ 0x80000000;
      auVar124._12_4_ = auVar93._12_4_ ^ 0x80000000;
      auVar125._0_4_ = -fVar58 / (fVar119 - fVar58);
      auVar125._4_12_ = auVar124._4_12_;
      auVar93 = vfmadd132ss_fma(ZEXT416((uint)(1.0 - auVar125._0_4_)),auVar125,ZEXT416(0));
      auVar94 = auVar93;
    }
    else {
      auVar93 = ZEXT816(0) << 0x20;
      if ((fVar58 != 0.0) || (auVar94 = SUB6416(ZEXT464(0x3f800000),0), NAN(fVar58))) {
        auVar93 = SUB6416(ZEXT464(0x7f800000),0);
        auVar94 = SUB6416(ZEXT464(0xff800000),0);
      }
    }
    auVar247 = vminss_avx(auVar247,auVar93);
    auVar240 = vmaxss_avx(auVar94,auVar240);
  }
  auVar126 = vcmpss_avx(auVar126,ZEXT416(0),1);
  auVar98._8_4_ = 0x3f800000;
  auVar98._0_8_ = 0x3f8000003f800000;
  auVar98._12_4_ = 0x3f800000;
  auVar114._8_4_ = 0xbf800000;
  auVar114._0_8_ = 0xbf800000bf800000;
  auVar114._12_4_ = 0xbf800000;
  auVar126 = vblendvps_avx(auVar98,auVar114,auVar126);
  fVar119 = auVar126._0_4_;
  if ((fVar57 != fVar119) || (NAN(fVar57) || NAN(fVar119))) {
    if ((fVar85 != fVar84) || (NAN(fVar85) || NAN(fVar84))) {
      auVar71._0_8_ = auVar146._0_8_ ^ 0x8000000080000000;
      auVar71._8_4_ = auVar146._8_4_ ^ 0x80000000;
      auVar71._12_4_ = auVar146._12_4_ ^ 0x80000000;
      auVar127._0_4_ = -fVar84 / (fVar85 - fVar84);
      auVar127._4_12_ = auVar71._4_12_;
      auVar126 = vfmadd132ss_fma(ZEXT416((uint)(1.0 - auVar127._0_4_)),auVar127,ZEXT416(0));
      auVar93 = auVar126;
    }
    else {
      auVar126 = SUB6416(ZEXT464(0x3f800000),0);
      if ((fVar84 != 0.0) || (auVar93 = SUB6416(ZEXT864(0),0) << 0x20, NAN(fVar84))) {
        auVar126 = SUB6416(ZEXT464(0xff800000),0);
        auVar93 = SUB6416(ZEXT464(0x7f800000),0);
      }
    }
    auVar247 = vminss_avx(auVar247,auVar93);
    auVar240 = vmaxss_avx(auVar126,auVar240);
  }
  if ((fVar268 != fVar119) || (NAN(fVar268) || NAN(fVar119))) {
    auVar247 = vminss_avx(auVar247,SUB6416(ZEXT464(0x3f800000),0));
    auVar240 = vmaxss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar240);
  }
  auVar126 = vmaxss_avx(ZEXT816(0) << 0x40,auVar247);
  auVar247 = vminss_avx(auVar240,SUB6416(ZEXT464(0x3f800000),0));
  if (auVar247._0_4_ < auVar126._0_4_) goto LAB_01108c41;
  auVar126 = vmaxss_avx(ZEXT816(0),ZEXT416((uint)(auVar126._0_4_ + -0.1)));
  auVar247 = vminss_avx(ZEXT416((uint)(auVar247._0_4_ + 0.1)),SUB6416(ZEXT464(0x3f800000),0));
  auVar137._0_8_ = auVar134._0_8_;
  auVar137._8_8_ = auVar137._0_8_;
  auVar211._8_8_ = auVar96._0_8_;
  auVar211._0_8_ = auVar96._0_8_;
  auVar228._8_8_ = auVar160._0_8_;
  auVar228._0_8_ = auVar160._0_8_;
  auVar93 = vshufpd_avx(auVar96,auVar96,3);
  auVar94 = vshufpd_avx(auVar160,auVar160,3);
  auVar240 = vshufps_avx(auVar126,auVar247,0);
  auVar72._8_4_ = 0x3f800000;
  auVar72._0_8_ = 0x3f8000003f800000;
  auVar72._12_4_ = 0x3f800000;
  auVar134 = vsubps_avx(auVar72,auVar240);
  local_508._0_4_ = auVar65._0_4_;
  local_508._4_4_ = auVar65._4_4_;
  fStack_500 = auVar65._8_4_;
  fStack_4fc = auVar65._12_4_;
  fVar119 = auVar240._0_4_;
  auVar73._0_4_ = fVar119 * (float)local_508._0_4_;
  fVar84 = auVar240._4_4_;
  auVar73._4_4_ = fVar84 * (float)local_508._4_4_;
  fVar85 = auVar240._8_4_;
  auVar73._8_4_ = fVar85 * fStack_500;
  fVar58 = auVar240._12_4_;
  auVar73._12_4_ = fVar58 * fStack_4fc;
  auVar172._0_4_ = fVar119 * auVar93._0_4_;
  auVar172._4_4_ = fVar84 * auVar93._4_4_;
  auVar172._8_4_ = fVar85 * auVar93._8_4_;
  auVar172._12_4_ = fVar58 * auVar93._12_4_;
  auVar184._0_4_ = fVar119 * auVar94._0_4_;
  auVar184._4_4_ = fVar84 * auVar94._4_4_;
  auVar184._8_4_ = fVar85 * auVar94._8_4_;
  auVar184._12_4_ = fVar58 * auVar94._12_4_;
  auVar200._0_4_ = fVar119 * auVar92._0_4_;
  auVar200._4_4_ = fVar84 * auVar92._4_4_;
  auVar200._8_4_ = fVar85 * auVar92._8_4_;
  auVar200._12_4_ = fVar58 * auVar92._12_4_;
  auVar93 = vfmadd231ps_fma(auVar73,auVar134,auVar137);
  auVar94 = vfmadd231ps_fma(auVar172,auVar134,auVar211);
  auVar240 = vfmadd231ps_fma(auVar184,auVar134,auVar228);
  auVar134 = vfmadd231ps_fma(auVar200,auVar134,ZEXT816(0));
  auVar65 = vmovshdup_avx(auVar66);
  auVar159 = vfmadd231ss_fma(ZEXT416((uint)(auVar65._0_4_ * auVar126._0_4_)),auVar66,
                             ZEXT416((uint)(1.0 - auVar126._0_4_)));
  auVar160 = vfmadd231ss_fma(ZEXT416((uint)(auVar65._0_4_ * auVar247._0_4_)),auVar66,
                             ZEXT416((uint)(1.0 - auVar247._0_4_)));
  fVar119 = 1.0 / fVar59;
  auVar66 = vsubps_avx(auVar94,auVar93);
  auVar212._0_4_ = auVar66._0_4_ * 3.0;
  auVar212._4_4_ = auVar66._4_4_ * 3.0;
  auVar212._8_4_ = auVar66._8_4_ * 3.0;
  auVar212._12_4_ = auVar66._12_4_ * 3.0;
  auVar66 = vsubps_avx(auVar240,auVar94);
  auVar229._0_4_ = auVar66._0_4_ * 3.0;
  auVar229._4_4_ = auVar66._4_4_ * 3.0;
  auVar229._8_4_ = auVar66._8_4_ * 3.0;
  auVar229._12_4_ = auVar66._12_4_ * 3.0;
  auVar66 = vsubps_avx(auVar134,auVar240);
  auVar241._0_4_ = auVar66._0_4_ * 3.0;
  auVar241._4_4_ = auVar66._4_4_ * 3.0;
  auVar241._8_4_ = auVar66._8_4_ * 3.0;
  auVar241._12_4_ = auVar66._12_4_ * 3.0;
  auVar126 = vminps_avx(auVar229,auVar241);
  auVar66 = vmaxps_avx(auVar229,auVar241);
  auVar126 = vminps_avx(auVar212,auVar126);
  auVar66 = vmaxps_avx(auVar212,auVar66);
  auVar65 = vshufpd_avx(auVar126,auVar126,3);
  auVar92 = vshufpd_avx(auVar66,auVar66,3);
  auVar126 = vminps_avx(auVar126,auVar65);
  auVar66 = vmaxps_avx(auVar66,auVar92);
  auVar230._0_4_ = auVar126._0_4_ * fVar119;
  auVar230._4_4_ = auVar126._4_4_ * fVar119;
  auVar230._8_4_ = auVar126._8_4_ * fVar119;
  auVar230._12_4_ = auVar126._12_4_ * fVar119;
  auVar213._0_4_ = auVar66._0_4_ * fVar119;
  auVar213._4_4_ = auVar66._4_4_ * fVar119;
  auVar213._8_4_ = auVar66._8_4_ * fVar119;
  auVar213._12_4_ = auVar66._12_4_ * fVar119;
  fVar119 = 1.0 / (auVar160._0_4_ - auVar159._0_4_);
  auVar66 = vshufpd_avx(auVar93,auVar93,3);
  auVar126 = vshufpd_avx(auVar94,auVar94,3);
  auVar65 = vshufpd_avx(auVar240,auVar240,3);
  auVar92 = vshufpd_avx(auVar134,auVar134,3);
  auVar66 = vsubps_avx(auVar66,auVar93);
  auVar247 = vsubps_avx(auVar126,auVar94);
  auVar93 = vsubps_avx(auVar65,auVar240);
  auVar92 = vsubps_avx(auVar92,auVar134);
  auVar126 = vminps_avx(auVar66,auVar247);
  auVar66 = vmaxps_avx(auVar66,auVar247);
  auVar65 = vminps_avx(auVar93,auVar92);
  auVar65 = vminps_avx(auVar126,auVar65);
  auVar126 = vmaxps_avx(auVar93,auVar92);
  auVar66 = vmaxps_avx(auVar66,auVar126);
  auVar259._0_4_ = fVar119 * auVar65._0_4_;
  auVar259._4_4_ = fVar119 * auVar65._4_4_;
  auVar259._8_4_ = fVar119 * auVar65._8_4_;
  auVar259._12_4_ = fVar119 * auVar65._12_4_;
  auVar248._0_4_ = fVar119 * auVar66._0_4_;
  auVar248._4_4_ = fVar119 * auVar66._4_4_;
  auVar248._8_4_ = fVar119 * auVar66._8_4_;
  auVar248._12_4_ = fVar119 * auVar66._12_4_;
  auVar92 = vinsertps_avx(auVar105,auVar159,0x10);
  auVar247 = vinsertps_avx(auVar15,auVar160,0x10);
  auVar242._0_4_ = (auVar92._0_4_ + auVar247._0_4_) * 0.5;
  auVar242._4_4_ = (auVar92._4_4_ + auVar247._4_4_) * 0.5;
  auVar242._8_4_ = (auVar92._8_4_ + auVar247._8_4_) * 0.5;
  auVar242._12_4_ = (auVar92._12_4_ + auVar247._12_4_) * 0.5;
  auVar74._4_4_ = auVar242._0_4_;
  auVar74._0_4_ = auVar242._0_4_;
  auVar74._8_4_ = auVar242._0_4_;
  auVar74._12_4_ = auVar242._0_4_;
  auVar15 = vfmadd213ps_fma(auVar9,auVar74,auVar12);
  auVar126 = vfmadd213ps_fma(auVar11,auVar74,auVar13);
  auVar65 = vfmadd213ps_fma(auVar145,auVar74,auVar14);
  auVar66 = vsubps_avx(auVar126,auVar15);
  auVar15 = vfmadd213ps_fma(auVar66,auVar74,auVar15);
  auVar66 = vsubps_avx(auVar65,auVar126);
  auVar66 = vfmadd213ps_fma(auVar66,auVar74,auVar126);
  auVar66 = vsubps_avx(auVar66,auVar15);
  auVar15 = vfmadd231ps_fma(auVar15,auVar66,auVar74);
  auVar75._0_8_ = CONCAT44(auVar66._4_4_ * 3.0,auVar66._0_4_ * 3.0);
  auVar75._8_4_ = auVar66._8_4_ * 3.0;
  auVar75._12_4_ = auVar66._12_4_ * 3.0;
  auVar274._8_8_ = auVar15._0_8_;
  auVar274._0_8_ = auVar15._0_8_;
  auVar66 = vshufpd_avx(auVar15,auVar15,3);
  auVar15 = vshufps_avx(auVar242,auVar242,0x55);
  auVar94 = vsubps_avx(auVar66,auVar274);
  auVar134 = vfmadd231ps_fma(auVar274,auVar15,auVar94);
  auVar280._8_8_ = auVar75._0_8_;
  auVar280._0_8_ = auVar75._0_8_;
  auVar66 = vshufpd_avx(auVar75,auVar75,3);
  auVar66 = vsubps_avx(auVar66,auVar280);
  auVar240 = vfmadd213ps_fma(auVar66,auVar15,auVar280);
  auVar15 = vmovshdup_avx(auVar240);
  auVar281._0_8_ = auVar15._0_8_ ^ 0x8000000080000000;
  auVar281._8_4_ = auVar15._8_4_ ^ 0x80000000;
  auVar281._12_4_ = auVar15._12_4_ ^ 0x80000000;
  auVar126 = vmovshdup_avx(auVar94);
  auVar66 = vunpcklps_avx(auVar126,auVar281);
  auVar65 = vshufps_avx(auVar66,auVar281,4);
  auVar93 = vshufps_avx(auVar242,auVar242,0x54);
  auVar128._0_8_ = auVar94._0_8_ ^ 0x8000000080000000;
  auVar128._8_4_ = auVar94._8_4_ ^ 0x80000000;
  auVar128._12_4_ = auVar94._12_4_ ^ 0x80000000;
  auVar66 = vmovlhps_avx(auVar128,auVar240);
  auVar66 = vshufps_avx(auVar66,auVar240,8);
  auVar15 = vfmsub231ss_fma(ZEXT416((uint)(auVar94._0_4_ * auVar15._0_4_)),auVar126,auVar240);
  uVar52 = auVar15._0_4_;
  auVar76._4_4_ = uVar52;
  auVar76._0_4_ = uVar52;
  auVar76._8_4_ = uVar52;
  auVar76._12_4_ = uVar52;
  auVar15 = vdivps_avx(auVar65,auVar76);
  auVar126 = vdivps_avx(auVar66,auVar76);
  fVar85 = auVar134._0_4_;
  fVar119 = auVar15._0_4_;
  auVar66 = vshufps_avx(auVar134,auVar134,0x55);
  fVar84 = auVar126._0_4_;
  auVar77._0_4_ = fVar85 * fVar119 + auVar66._0_4_ * fVar84;
  auVar77._4_4_ = fVar85 * auVar15._4_4_ + auVar66._4_4_ * auVar126._4_4_;
  auVar77._8_4_ = fVar85 * auVar15._8_4_ + auVar66._8_4_ * auVar126._8_4_;
  auVar77._12_4_ = fVar85 * auVar15._12_4_ + auVar66._12_4_ * auVar126._12_4_;
  auVar147 = vsubps_avx(auVar93,auVar77);
  auVar93 = vmovshdup_avx(auVar15);
  auVar66 = vinsertps_avx(auVar230,auVar259,0x1c);
  auVar150._0_4_ = auVar93._0_4_ * auVar66._0_4_;
  auVar150._4_4_ = auVar93._4_4_ * auVar66._4_4_;
  auVar150._8_4_ = auVar93._8_4_ * auVar66._8_4_;
  auVar150._12_4_ = auVar93._12_4_ * auVar66._12_4_;
  auVar65 = vinsertps_avx(auVar213,auVar248,0x1c);
  auVar99._0_4_ = auVar65._0_4_ * auVar93._0_4_;
  auVar99._4_4_ = auVar65._4_4_ * auVar93._4_4_;
  auVar99._8_4_ = auVar65._8_4_ * auVar93._8_4_;
  auVar99._12_4_ = auVar65._12_4_ * auVar93._12_4_;
  auVar134 = vminps_avx(auVar150,auVar99);
  auVar240 = vmaxps_avx(auVar99,auVar150);
  auVar93 = vinsertps_avx(auVar259,auVar230,0x4c);
  auVar146 = vmovshdup_avx(auVar126);
  auVar94 = vinsertps_avx(auVar248,auVar213,0x4c);
  auVar249._0_4_ = auVar146._0_4_ * auVar93._0_4_;
  auVar249._4_4_ = auVar146._4_4_ * auVar93._4_4_;
  auVar249._8_4_ = auVar146._8_4_ * auVar93._8_4_;
  auVar249._12_4_ = auVar146._12_4_ * auVar93._12_4_;
  auVar231._0_4_ = auVar146._0_4_ * auVar94._0_4_;
  auVar231._4_4_ = auVar146._4_4_ * auVar94._4_4_;
  auVar231._8_4_ = auVar146._8_4_ * auVar94._8_4_;
  auVar231._12_4_ = auVar146._12_4_ * auVar94._12_4_;
  auVar146 = vminps_avx(auVar249,auVar231);
  auVar260._0_4_ = auVar134._0_4_ + auVar146._0_4_;
  auVar260._4_4_ = auVar134._4_4_ + auVar146._4_4_;
  auVar260._8_4_ = auVar134._8_4_ + auVar146._8_4_;
  auVar260._12_4_ = auVar134._12_4_ + auVar146._12_4_;
  auVar134 = vmaxps_avx(auVar231,auVar249);
  auVar100._0_4_ = auVar134._0_4_ + auVar240._0_4_;
  auVar100._4_4_ = auVar134._4_4_ + auVar240._4_4_;
  auVar100._8_4_ = auVar134._8_4_ + auVar240._8_4_;
  auVar100._12_4_ = auVar134._12_4_ + auVar240._12_4_;
  auVar232._8_8_ = 0x3f80000000000000;
  auVar232._0_8_ = 0x3f80000000000000;
  auVar240 = vsubps_avx(auVar232,auVar100);
  auVar134 = vsubps_avx(auVar232,auVar260);
  auVar146 = vsubps_avx(auVar92,auVar242);
  auVar123 = vsubps_avx(auVar247,auVar242);
  auVar115._0_4_ = fVar119 * auVar66._0_4_;
  auVar115._4_4_ = fVar119 * auVar66._4_4_;
  auVar115._8_4_ = fVar119 * auVar66._8_4_;
  auVar115._12_4_ = fVar119 * auVar66._12_4_;
  auVar261._0_4_ = fVar119 * auVar65._0_4_;
  auVar261._4_4_ = fVar119 * auVar65._4_4_;
  auVar261._8_4_ = fVar119 * auVar65._8_4_;
  auVar261._12_4_ = fVar119 * auVar65._12_4_;
  auVar65 = vminps_avx(auVar115,auVar261);
  auVar66 = vmaxps_avx(auVar261,auVar115);
  auVar151._0_4_ = fVar84 * auVar93._0_4_;
  auVar151._4_4_ = fVar84 * auVar93._4_4_;
  auVar151._8_4_ = fVar84 * auVar93._8_4_;
  auVar151._12_4_ = fVar84 * auVar93._12_4_;
  auVar214._0_4_ = fVar84 * auVar94._0_4_;
  auVar214._4_4_ = fVar84 * auVar94._4_4_;
  auVar214._8_4_ = fVar84 * auVar94._8_4_;
  auVar214._12_4_ = fVar84 * auVar94._12_4_;
  auVar93 = vminps_avx(auVar151,auVar214);
  auVar262._0_4_ = auVar65._0_4_ + auVar93._0_4_;
  auVar262._4_4_ = auVar65._4_4_ + auVar93._4_4_;
  auVar262._8_4_ = auVar65._8_4_ + auVar93._8_4_;
  auVar262._12_4_ = auVar65._12_4_ + auVar93._12_4_;
  fVar268 = auVar146._0_4_;
  auVar275._0_4_ = fVar268 * auVar240._0_4_;
  fVar269 = auVar146._4_4_;
  auVar275._4_4_ = fVar269 * auVar240._4_4_;
  fVar190 = auVar146._8_4_;
  auVar275._8_4_ = fVar190 * auVar240._8_4_;
  fVar191 = auVar146._12_4_;
  auVar275._12_4_ = fVar191 * auVar240._12_4_;
  auVar65 = vmaxps_avx(auVar214,auVar151);
  auVar215._0_4_ = fVar268 * auVar134._0_4_;
  auVar215._4_4_ = fVar269 * auVar134._4_4_;
  auVar215._8_4_ = fVar190 * auVar134._8_4_;
  auVar215._12_4_ = fVar191 * auVar134._12_4_;
  fVar85 = auVar123._0_4_;
  auVar101._0_4_ = fVar85 * auVar240._0_4_;
  fVar58 = auVar123._4_4_;
  auVar101._4_4_ = fVar58 * auVar240._4_4_;
  fVar57 = auVar123._8_4_;
  auVar101._8_4_ = fVar57 * auVar240._8_4_;
  fVar221 = auVar123._12_4_;
  auVar101._12_4_ = fVar221 * auVar240._12_4_;
  auVar233._0_4_ = fVar85 * auVar134._0_4_;
  auVar233._4_4_ = fVar58 * auVar134._4_4_;
  auVar233._8_4_ = fVar57 * auVar134._8_4_;
  auVar233._12_4_ = fVar221 * auVar134._12_4_;
  auVar116._0_4_ = auVar66._0_4_ + auVar65._0_4_;
  auVar116._4_4_ = auVar66._4_4_ + auVar65._4_4_;
  auVar116._8_4_ = auVar66._8_4_ + auVar65._8_4_;
  auVar116._12_4_ = auVar66._12_4_ + auVar65._12_4_;
  auVar152._8_8_ = 0x3f800000;
  auVar152._0_8_ = 0x3f800000;
  auVar66 = vsubps_avx(auVar152,auVar116);
  auVar65 = vsubps_avx(auVar152,auVar262);
  auVar263._0_4_ = fVar268 * auVar66._0_4_;
  auVar263._4_4_ = fVar269 * auVar66._4_4_;
  auVar263._8_4_ = fVar190 * auVar66._8_4_;
  auVar263._12_4_ = fVar191 * auVar66._12_4_;
  auVar250._0_4_ = fVar268 * auVar65._0_4_;
  auVar250._4_4_ = fVar269 * auVar65._4_4_;
  auVar250._8_4_ = fVar190 * auVar65._8_4_;
  auVar250._12_4_ = fVar191 * auVar65._12_4_;
  auVar117._0_4_ = fVar85 * auVar66._0_4_;
  auVar117._4_4_ = fVar58 * auVar66._4_4_;
  auVar117._8_4_ = fVar57 * auVar66._8_4_;
  auVar117._12_4_ = fVar221 * auVar66._12_4_;
  auVar153._0_4_ = fVar85 * auVar65._0_4_;
  auVar153._4_4_ = fVar58 * auVar65._4_4_;
  auVar153._8_4_ = fVar57 * auVar65._8_4_;
  auVar153._12_4_ = fVar221 * auVar65._12_4_;
  auVar66 = vminps_avx(auVar263,auVar250);
  auVar65 = vminps_avx(auVar117,auVar153);
  auVar66 = vminps_avx(auVar66,auVar65);
  auVar65 = vmaxps_avx(auVar250,auVar263);
  auVar93 = vmaxps_avx(auVar153,auVar117);
  auVar94 = vminps_avx(auVar275,auVar215);
  auVar240 = vminps_avx(auVar101,auVar233);
  auVar94 = vminps_avx(auVar94,auVar240);
  auVar66 = vhaddps_avx(auVar66,auVar94);
  auVar65 = vmaxps_avx(auVar93,auVar65);
  auVar93 = vmaxps_avx(auVar215,auVar275);
  auVar94 = vmaxps_avx(auVar233,auVar101);
  auVar93 = vmaxps_avx(auVar94,auVar93);
  auVar65 = vhaddps_avx(auVar65,auVar93);
  auVar66 = vshufps_avx(auVar66,auVar66,0xe8);
  auVar65 = vshufps_avx(auVar65,auVar65,0xe8);
  auVar234._0_4_ = auVar147._0_4_ + auVar66._0_4_;
  auVar234._4_4_ = auVar147._4_4_ + auVar66._4_4_;
  auVar234._8_4_ = auVar147._8_4_ + auVar66._8_4_;
  auVar234._12_4_ = auVar147._12_4_ + auVar66._12_4_;
  auVar216._0_4_ = auVar147._0_4_ + auVar65._0_4_;
  auVar216._4_4_ = auVar147._4_4_ + auVar65._4_4_;
  auVar216._8_4_ = auVar147._8_4_ + auVar65._8_4_;
  auVar216._12_4_ = auVar147._12_4_ + auVar65._12_4_;
  auVar219 = ZEXT1664(auVar216);
  auVar66 = vmaxps_avx(auVar92,auVar234);
  auVar65 = vminps_avx(auVar216,auVar247);
  auVar66 = vcmpps_avx(auVar65,auVar66,1);
  auVar66 = vshufps_avx(auVar66,auVar66,0x50);
  if ((auVar66 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0 || auVar66[0xf] < '\0')
  goto LAB_01108c41;
  bVar50 = 0;
  if ((auVar189._0_4_ < auVar234._0_4_) && (bVar50 = 0, auVar216._0_4_ < auVar247._0_4_)) {
    auVar65 = vmovshdup_avx(auVar234);
    auVar66 = vcmpps_avx(auVar216,auVar247,1);
    bVar50 = auVar66[4] & auVar159._0_4_ < auVar65._0_4_;
  }
  p03.field_0.i[0] = auVar63._0_4_;
  p03.field_0.i[1] = auVar63._4_4_;
  p03.field_0.i[2] = auVar63._8_4_;
  p03.field_0.i[3] = auVar63._12_4_;
  if (((3 < (uint)uVar55 || fVar59 < 0.001) | bVar50) == 1) {
    lVar49 = 0xc9;
    auVar219 = ZEXT464(0x40400000);
    do {
      lVar49 = lVar49 + -1;
      if (lVar49 == 0) goto LAB_01108c41;
      fVar58 = auVar147._0_4_;
      fVar85 = 1.0 - fVar58;
      fVar59 = fVar85 * fVar85 * fVar85;
      fVar86 = fVar58 * 3.0 * fVar85 * fVar85;
      fVar85 = fVar85 * fVar58 * fVar58 * 3.0;
      auVar138._4_4_ = fVar59;
      auVar138._0_4_ = fVar59;
      auVar138._8_4_ = fVar59;
      auVar138._12_4_ = fVar59;
      auVar118._4_4_ = fVar86;
      auVar118._0_4_ = fVar86;
      auVar118._8_4_ = fVar86;
      auVar118._12_4_ = fVar86;
      auVar102._4_4_ = fVar85;
      auVar102._0_4_ = fVar85;
      auVar102._8_4_ = fVar85;
      auVar102._12_4_ = fVar85;
      fVar58 = fVar58 * fVar58 * fVar58;
      auVar154._0_4_ = p03.field_0.v[0] * fVar58;
      auVar154._4_4_ = p03.field_0.v[1] * fVar58;
      auVar154._8_4_ = p03.field_0.v[2] * fVar58;
      auVar154._12_4_ = p03.field_0.v[3] * fVar58;
      auVar105 = vfmadd231ps_fma(auVar154,auVar14,auVar102);
      auVar105 = vfmadd231ps_fma(auVar105,auVar13,auVar118);
      auVar105 = vfmadd231ps_fma(auVar105,auVar12,auVar138);
      auVar103._8_8_ = auVar105._0_8_;
      auVar103._0_8_ = auVar105._0_8_;
      auVar105 = vshufpd_avx(auVar105,auVar105,3);
      auVar66 = vshufps_avx(auVar147,auVar147,0x55);
      auVar105 = vsubps_avx(auVar105,auVar103);
      auVar66 = vfmadd213ps_fma(auVar105,auVar66,auVar103);
      fVar59 = auVar66._0_4_;
      auVar105 = vshufps_avx(auVar66,auVar66,0x55);
      auVar104._0_4_ = fVar119 * fVar59 + fVar84 * auVar105._0_4_;
      auVar104._4_4_ = auVar15._4_4_ * fVar59 + auVar126._4_4_ * auVar105._4_4_;
      auVar104._8_4_ = auVar15._8_4_ * fVar59 + auVar126._8_4_ * auVar105._8_4_;
      auVar104._12_4_ = auVar15._12_4_ * fVar59 + auVar126._12_4_ * auVar105._12_4_;
      auVar147 = vsubps_avx(auVar147,auVar104);
      auVar105 = vandps_avx(auVar238,auVar66);
      auVar66 = vshufps_avx(auVar105,auVar105,0xf5);
      auVar105 = vmaxss_avx(auVar66,auVar105);
    } while (fVar83 <= auVar105._0_4_);
    fVar59 = auVar147._0_4_;
    if ((0.0 <= fVar59) && (fVar59 <= 1.0)) {
      auVar105 = vmovshdup_avx(auVar147);
      fVar86 = auVar105._0_4_;
      if ((0.0 <= fVar86) && (fVar86 <= 1.0)) {
        auVar105 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                 ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c);
        auVar93 = vinsertps_avx(auVar105,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128[2]),0x28);
        auVar105 = vdpps_avx(auVar93,auVar91,0x7f);
        auVar66 = vdpps_avx(auVar93,auVar120,0x7f);
        auVar15 = vdpps_avx(auVar93,auVar133,0x7f);
        auVar126 = vdpps_avx(auVar93,auVar60,0x7f);
        auVar65 = vdpps_avx(auVar93,auVar89,0x7f);
        auVar92 = vdpps_avx(auVar93,auVar132,0x7f);
        auVar247 = vdpps_avx(auVar93,auVar144,0x7f);
        auVar93 = vdpps_avx(auVar93,auVar111,0x7f);
        fVar119 = 1.0 - fVar86;
        auVar105 = vfmadd231ss_fma(ZEXT416((uint)(fVar86 * auVar65._0_4_)),ZEXT416((uint)fVar119),
                                   auVar105);
        auVar66 = vfmadd231ss_fma(ZEXT416((uint)(auVar92._0_4_ * fVar86)),ZEXT416((uint)fVar119),
                                  auVar66);
        auVar15 = vfmadd231ss_fma(ZEXT416((uint)(auVar247._0_4_ * fVar86)),ZEXT416((uint)fVar119),
                                  auVar15);
        auVar219 = ZEXT1664(auVar15);
        auVar126 = vfmadd231ss_fma(ZEXT416((uint)(fVar86 * auVar93._0_4_)),ZEXT416((uint)fVar119),
                                   auVar126);
        fVar58 = 1.0 - fVar59;
        fVar119 = fVar58 * fVar59 * fVar59 * 3.0;
        fVar221 = fVar59 * fVar59 * fVar59;
        auVar15 = vfmadd231ss_fma(ZEXT416((uint)(fVar221 * auVar126._0_4_)),ZEXT416((uint)fVar119),
                                  auVar15);
        fVar84 = fVar59 * 3.0 * fVar58 * fVar58;
        auVar66 = vfmadd231ss_fma(auVar15,ZEXT416((uint)fVar84),auVar66);
        fVar85 = fVar58 * fVar58 * fVar58;
        auVar105 = vfmadd231ss_fma(auVar66,ZEXT416((uint)fVar85),auVar105);
        fVar57 = auVar105._0_4_;
        if (((fVar56 <= fVar57) && (fVar268 = *(float *)(ray + k * 4 + 0x80), fVar57 <= fVar268)) &&
           (pGVar5 = (context->scene->geometries).items[uVar48].ptr,
           (pGVar5->mask & *(uint *)(ray + k * 4 + 0x90)) != 0)) {
          auVar105 = vshufps_avx(auVar147,auVar147,0x55);
          auVar217._8_4_ = 0x3f800000;
          auVar217._0_8_ = 0x3f8000003f800000;
          auVar217._12_4_ = 0x3f800000;
          auVar66 = vsubps_avx(auVar217,auVar105);
          fVar269 = auVar105._0_4_;
          auVar235._0_4_ = fVar269 * auVar226._0_4_;
          fVar190 = auVar105._4_4_;
          auVar235._4_4_ = fVar190 * auVar226._4_4_;
          fVar191 = auVar105._8_4_;
          auVar235._8_4_ = fVar191 * auVar226._8_4_;
          fVar192 = auVar105._12_4_;
          auVar235._12_4_ = fVar192 * auVar226._12_4_;
          auVar243._0_4_ = fVar269 * auVar64._0_4_;
          auVar243._4_4_ = fVar190 * auVar64._4_4_;
          auVar243._8_4_ = fVar191 * auVar64._8_4_;
          auVar243._12_4_ = fVar192 * auVar64._12_4_;
          local_498 = auVar143._0_4_;
          fStack_494 = auVar143._4_4_;
          fStack_490 = auVar143._8_4_;
          fStack_48c = auVar143._12_4_;
          auVar251._0_4_ = fVar269 * local_498;
          auVar251._4_4_ = fVar190 * fStack_494;
          auVar251._8_4_ = fVar191 * fStack_490;
          auVar251._12_4_ = fVar192 * fStack_48c;
          auVar264._0_4_ = fVar269 * fVar157;
          auVar264._4_4_ = fVar190 * fVar175;
          auVar264._8_4_ = fVar191 * fVar176;
          auVar264._12_4_ = fVar192 * fVar177;
          auVar15 = vfmadd231ps_fma(auVar235,auVar66,auVar62);
          auVar126 = vfmadd231ps_fma(auVar243,auVar66,auVar121);
          auVar65 = vfmadd231ps_fma(auVar251,auVar66,auVar61);
          auVar92 = vfmadd231ps_fma(auVar264,auVar66,auVar90);
          auVar66 = vsubps_avx(auVar126,auVar15);
          auVar15 = vsubps_avx(auVar65,auVar126);
          auVar126 = vsubps_avx(auVar92,auVar65);
          local_218._4_4_ = fVar59;
          local_218._0_4_ = fVar59;
          local_218._8_4_ = fVar59;
          local_218._12_4_ = fVar59;
          auVar219 = ZEXT1664(local_218);
          auVar265._0_4_ = fVar59 * auVar15._0_4_;
          auVar265._4_4_ = fVar59 * auVar15._4_4_;
          auVar265._8_4_ = fVar59 * auVar15._8_4_;
          auVar265._12_4_ = fVar59 * auVar15._12_4_;
          auVar201._4_4_ = fVar58;
          auVar201._0_4_ = fVar58;
          auVar201._8_4_ = fVar58;
          auVar201._12_4_ = fVar58;
          auVar66 = vfmadd231ps_fma(auVar265,auVar201,auVar66);
          auVar236._0_4_ = fVar59 * auVar126._0_4_;
          auVar236._4_4_ = fVar59 * auVar126._4_4_;
          auVar236._8_4_ = fVar59 * auVar126._8_4_;
          auVar236._12_4_ = fVar59 * auVar126._12_4_;
          auVar15 = vfmadd231ps_fma(auVar236,auVar201,auVar15);
          auVar237._0_4_ = fVar59 * auVar15._0_4_;
          auVar237._4_4_ = fVar59 * auVar15._4_4_;
          auVar237._8_4_ = fVar59 * auVar15._8_4_;
          auVar237._12_4_ = fVar59 * auVar15._12_4_;
          auVar15 = vfmadd231ps_fma(auVar237,auVar201,auVar66);
          local_368 = auVar206._0_4_;
          fStack_364 = auVar206._4_4_;
          fStack_360 = auVar206._8_4_;
          fStack_35c = auVar206._12_4_;
          auVar185._0_4_ = fVar221 * local_368;
          auVar185._4_4_ = fVar221 * fStack_364;
          auVar185._8_4_ = fVar221 * fStack_360;
          auVar185._12_4_ = fVar221 * fStack_35c;
          auVar139._4_4_ = fVar119;
          auVar139._0_4_ = fVar119;
          auVar139._8_4_ = fVar119;
          auVar139._12_4_ = fVar119;
          auVar66 = vfmadd132ps_fma(auVar139,auVar185,auVar179);
          auVar173._4_4_ = fVar84;
          auVar173._0_4_ = fVar84;
          auVar173._8_4_ = fVar84;
          auVar173._12_4_ = fVar84;
          auVar66 = vfmadd132ps_fma(auVar173,auVar66,auVar178);
          auVar186._0_4_ = auVar15._0_4_ * 3.0;
          auVar186._4_4_ = auVar15._4_4_ * 3.0;
          auVar186._8_4_ = auVar15._8_4_ * 3.0;
          auVar186._12_4_ = auVar15._12_4_ * 3.0;
          auVar155._4_4_ = fVar85;
          auVar155._0_4_ = fVar85;
          auVar155._8_4_ = fVar85;
          auVar155._12_4_ = fVar85;
          auVar15 = vfmadd132ps_fma(auVar155,auVar66,auVar158);
          auVar66 = vshufps_avx(auVar186,auVar186,0xc9);
          auVar140._0_4_ = auVar15._0_4_ * auVar66._0_4_;
          auVar140._4_4_ = auVar15._4_4_ * auVar66._4_4_;
          auVar140._8_4_ = auVar15._8_4_ * auVar66._8_4_;
          auVar140._12_4_ = auVar15._12_4_ * auVar66._12_4_;
          auVar66 = vshufps_avx(auVar15,auVar15,0xc9);
          auVar66 = vfmsub231ps_fma(auVar140,auVar186,auVar66);
          local_228 = auVar66._0_4_;
          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
             (pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
            *(float *)(ray + k * 4 + 0x80) = fVar57;
            uVar52 = vextractps_avx(auVar66,1);
            *(undefined4 *)(ray + k * 4 + 0xc0) = uVar52;
            uVar52 = vextractps_avx(auVar66,2);
            *(undefined4 *)(ray + k * 4 + 0xd0) = uVar52;
            *(undefined4 *)(ray + k * 4 + 0xe0) = local_228;
            *(float *)(ray + k * 4 + 0xf0) = fVar59;
            *(float *)(ray + k * 4 + 0x100) = fVar86;
            *(uint *)(ray + k * 4 + 0x110) = uVar4;
            *(uint *)(ray + k * 4 + 0x120) = uVar48;
            *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
            *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
          }
          else {
            auVar15 = vshufps_avx(auVar66,auVar66,0x55);
            auVar66 = vshufps_avx(auVar66,auVar66,0xaa);
            local_248[0] = (RTCHitN)auVar15[0];
            local_248[1] = (RTCHitN)auVar15[1];
            local_248[2] = (RTCHitN)auVar15[2];
            local_248[3] = (RTCHitN)auVar15[3];
            local_248[4] = (RTCHitN)auVar15[4];
            local_248[5] = (RTCHitN)auVar15[5];
            local_248[6] = (RTCHitN)auVar15[6];
            local_248[7] = (RTCHitN)auVar15[7];
            local_248[8] = (RTCHitN)auVar15[8];
            local_248[9] = (RTCHitN)auVar15[9];
            local_248[10] = (RTCHitN)auVar15[10];
            local_248[0xb] = (RTCHitN)auVar15[0xb];
            local_248[0xc] = (RTCHitN)auVar15[0xc];
            local_248[0xd] = (RTCHitN)auVar15[0xd];
            local_248[0xe] = (RTCHitN)auVar15[0xe];
            local_248[0xf] = (RTCHitN)auVar15[0xf];
            local_238 = auVar66;
            uStack_224 = local_228;
            uStack_220 = local_228;
            uStack_21c = local_228;
            local_208 = auVar105;
            local_1f8 = CONCAT44(uVar4,uVar4);
            uStack_1f0 = CONCAT44(uVar4,uVar4);
            local_1e8._4_4_ = uVar48;
            local_1e8._0_4_ = uVar48;
            local_1e8._8_4_ = uVar48;
            local_1e8._12_4_ = uVar48;
            vpcmpeqd_avx2(ZEXT1632(local_1e8),ZEXT1632(local_1e8));
            uStack_1d4 = context->user->instID[0];
            local_1d8 = uStack_1d4;
            uStack_1d0 = uStack_1d4;
            uStack_1cc = uStack_1d4;
            uStack_1c8 = context->user->instPrimID[0];
            uStack_1c4 = uStack_1c8;
            uStack_1c0 = uStack_1c8;
            uStack_1bc = uStack_1c8;
            *(float *)(ray + k * 4 + 0x80) = fVar57;
            local_528 = *local_510;
            args.valid = (int *)local_528;
            args.geometryUserPtr = pGVar5->userPtr;
            args.context = context->user;
            args.hit = local_248;
            args.N = 4;
            args.ray = (RTCRayN *)ray;
            if (pGVar5->intersectionFilterN != (RTCFilterFunctionN)0x0) {
              auVar219 = ZEXT1664(local_218);
              (*pGVar5->intersectionFilterN)(&args);
              auVar110._8_56_ = extraout_var;
              auVar110._0_8_ = extraout_XMM1_Qa;
              auVar66 = auVar110._0_16_;
            }
            if (local_528 == (undefined1  [16])0x0) {
              auVar105 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
              auVar66 = vpcmpeqd_avx(auVar66,auVar66);
              auVar105 = auVar105 ^ auVar66;
            }
            else {
              p_Var6 = context->args->filter;
              auVar66 = vpcmpeqd_avx(auVar105,auVar105);
              if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                   RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
                auVar219 = ZEXT1664(auVar219._0_16_);
                (*p_Var6)(&args);
                auVar66 = vpcmpeqd_avx(auVar66,auVar66);
              }
              auVar15 = vpcmpeqd_avx(local_528,_DAT_01f45a50);
              auVar105 = auVar15 ^ auVar66;
              if (local_528 != (undefined1  [16])0x0) {
                auVar15 = auVar15 ^ auVar66;
                auVar66 = vmaskmovps_avx(auVar15,*(undefined1 (*) [16])args.hit);
                *(undefined1 (*) [16])(args.ray + 0xc0) = auVar66;
                auVar66 = vmaskmovps_avx(auVar15,*(undefined1 (*) [16])(args.hit + 0x10));
                *(undefined1 (*) [16])(args.ray + 0xd0) = auVar66;
                auVar66 = vmaskmovps_avx(auVar15,*(undefined1 (*) [16])(args.hit + 0x20));
                *(undefined1 (*) [16])(args.ray + 0xe0) = auVar66;
                auVar66 = vmaskmovps_avx(auVar15,*(undefined1 (*) [16])(args.hit + 0x30));
                *(undefined1 (*) [16])(args.ray + 0xf0) = auVar66;
                auVar66 = vmaskmovps_avx(auVar15,*(undefined1 (*) [16])(args.hit + 0x40));
                *(undefined1 (*) [16])(args.ray + 0x100) = auVar66;
                auVar66 = vmaskmovps_avx(auVar15,*(undefined1 (*) [16])(args.hit + 0x50));
                *(undefined1 (*) [16])(args.ray + 0x110) = auVar66;
                auVar66 = vmaskmovps_avx(auVar15,*(undefined1 (*) [16])(args.hit + 0x60));
                *(undefined1 (*) [16])(args.ray + 0x120) = auVar66;
                auVar66 = vmaskmovps_avx(auVar15,*(undefined1 (*) [16])(args.hit + 0x70));
                *(undefined1 (*) [16])(args.ray + 0x130) = auVar66;
                auVar66 = vmaskmovps_avx(auVar15,*(undefined1 (*) [16])(args.hit + 0x80));
                *(undefined1 (*) [16])(args.ray + 0x140) = auVar66;
              }
            }
            auVar78._8_8_ = 0x100000001;
            auVar78._0_8_ = 0x100000001;
            if ((auVar78 & auVar105) == (undefined1  [16])0x0) {
              *(float *)(ray + k * 4 + 0x80) = fVar268;
            }
          }
        }
      }
    }
    goto LAB_01108c41;
  }
  auVar105 = vinsertps_avx(auVar105,ZEXT416((uint)fVar86),0x10);
  auVar66 = vinsertps_avx(auVar159,ZEXT416((uint)auVar160._0_4_),0x10);
  goto LAB_01108695;
}

Assistant:

static __forceinline void intersect_n(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);

          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }